

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::sse2::CurveNiIntersectorK<4,4>::
     occluded_t<embree::sse2::RibbonCurve1IntersectorK<embree::BSplineCurveT,4,4>,embree::sse2::Occluded1KEpilogMU<4,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  undefined1 (*pauVar2) [12];
  Primitive *pPVar3;
  Primitive PVar4;
  undefined4 uVar5;
  int iVar6;
  Geometry *pGVar7;
  __int_type_conflict _Var8;
  long lVar9;
  undefined8 uVar10;
  undefined6 uVar11;
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  int iVar31;
  int iVar32;
  ulong uVar33;
  RTCFilterFunctionN p_Var34;
  RTCRayN *pRVar35;
  undefined1 *puVar36;
  byte bVar37;
  ulong uVar38;
  Geometry *pGVar39;
  bool bVar40;
  ulong uVar41;
  Geometry *geometry;
  long lVar42;
  ulong uVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  short sVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  uint uVar52;
  undefined2 uVar82;
  float fVar83;
  float fVar87;
  undefined1 auVar53 [16];
  undefined1 auVar56 [16];
  undefined1 auVar59 [16];
  float fVar84;
  float fVar88;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar66 [16];
  undefined1 auVar69 [16];
  undefined1 auVar72 [16];
  undefined1 auVar75 [16];
  float fVar85;
  uint uVar86;
  float fVar89;
  uint uVar90;
  float fVar91;
  uint uVar92;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar93;
  float fVar94;
  float fVar109;
  float fVar111;
  vfloat4 v;
  undefined1 auVar95 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar110;
  float fVar112;
  float fVar113;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar114;
  float fVar120;
  float fVar122;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar121;
  float fVar123;
  float fVar124;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar134;
  float fVar137;
  undefined1 auVar128 [16];
  float fVar135;
  float fVar138;
  float fVar140;
  undefined1 auVar129 [16];
  float fVar136;
  float fVar139;
  float fVar141;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar156;
  float fVar159;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar157;
  float fVar158;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar164;
  float fVar165;
  float fVar178;
  float fVar180;
  undefined1 auVar166 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar179;
  float fVar181;
  float fVar182;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  float fVar183;
  float fVar184;
  float fVar189;
  float fVar191;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  float fVar190;
  float fVar192;
  float fVar193;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  float fVar194;
  float fVar212;
  float fVar213;
  undefined1 auVar195 [16];
  undefined1 auVar198 [16];
  undefined1 auVar201 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar214;
  float fVar218;
  float fVar219;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  float fVar220;
  float fVar222;
  float fVar223;
  undefined1 auVar221 [16];
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar235;
  float fVar237;
  undefined1 auVar229 [16];
  float fVar240;
  undefined1 auVar232 [16];
  float fVar236;
  float fVar238;
  float fVar239;
  float fVar241;
  float fVar242;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar251;
  float fVar254;
  float fVar257;
  undefined1 auVar246 [16];
  float fVar252;
  float fVar255;
  float fVar258;
  undefined1 auVar247 [16];
  float fVar253;
  float fVar256;
  float fVar259;
  float fVar260;
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  float fVar269;
  float fVar270;
  float fVar271;
  float fVar272;
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_4> bhit;
  ulong local_4d8;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined4 uStack_3dc;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  undefined1 local_3a8 [16];
  ulong local_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  RayQueryContext *local_328;
  undefined1 (*local_320) [16];
  RTCFilterFunctionNArguments local_318;
  undefined1 local_2e8 [16];
  ulong local_2d8;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [8];
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  LinearSpace3fa *local_230;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [16];
  uint local_1c8;
  int local_1c4;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [16];
  float local_168 [4];
  undefined8 local_158;
  undefined8 uStack_150;
  undefined1 local_148 [16];
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined4 local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  uint local_c8;
  uint uStack_c4;
  uint uStack_c0;
  uint uStack_bc;
  uint local_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  int local_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 uVar81;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  
  PVar4 = prim[1];
  uVar33 = (ulong)(byte)PVar4;
  pPVar3 = prim + uVar33 * 0x19 + 6;
  fVar122 = *(float *)(pPVar3 + 0xc);
  fVar125 = (*(float *)(ray + k * 4) - *(float *)pPVar3) * fVar122;
  fVar134 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar3 + 4)) * fVar122;
  fVar137 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar3 + 8)) * fVar122;
  fVar114 = *(float *)(ray + k * 4 + 0x40) * fVar122;
  fVar120 = *(float *)(ray + k * 4 + 0x50) * fVar122;
  fVar122 = *(float *)(ray + k * 4 + 0x60) * fVar122;
  uVar5 = *(undefined4 *)(prim + uVar33 * 4 + 6);
  uVar81 = (undefined1)((uint)uVar5 >> 0x18);
  uVar82 = CONCAT11(uVar81,uVar81);
  uVar81 = (undefined1)((uint)uVar5 >> 0x10);
  uVar10 = CONCAT35(CONCAT21(uVar82,uVar81),CONCAT14(uVar81,uVar5));
  uVar81 = (undefined1)((uint)uVar5 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar10 >> 0x20),uVar81),uVar81);
  sVar48 = CONCAT11((char)uVar5,(char)uVar5);
  uVar43 = CONCAT62(uVar11,sVar48);
  auVar62._8_4_ = 0;
  auVar62._0_8_ = uVar43;
  auVar62._12_2_ = uVar82;
  auVar62._14_2_ = uVar82;
  uVar82 = (undefined2)((ulong)uVar10 >> 0x20);
  auVar171._12_4_ = auVar62._12_4_;
  auVar171._8_2_ = 0;
  auVar171._0_8_ = uVar43;
  auVar171._10_2_ = uVar82;
  auVar172._10_6_ = auVar171._10_6_;
  auVar172._8_2_ = uVar82;
  auVar172._0_8_ = uVar43;
  uVar82 = (undefined2)uVar11;
  auVar12._4_8_ = auVar172._8_8_;
  auVar12._2_2_ = uVar82;
  auVar12._0_2_ = uVar82;
  fVar93 = (float)((int)sVar48 >> 8);
  fVar109 = (float)(auVar12._0_4_ >> 0x18);
  fVar111 = (float)(auVar172._8_4_ >> 0x18);
  uVar5 = *(undefined4 *)(prim + uVar33 * 5 + 6);
  uVar81 = (undefined1)((uint)uVar5 >> 0x18);
  uVar82 = CONCAT11(uVar81,uVar81);
  uVar81 = (undefined1)((uint)uVar5 >> 0x10);
  uVar10 = CONCAT35(CONCAT21(uVar82,uVar81),CONCAT14(uVar81,uVar5));
  uVar81 = (undefined1)((uint)uVar5 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar10 >> 0x20),uVar81),uVar81);
  sVar48 = CONCAT11((char)uVar5,(char)uVar5);
  uVar43 = CONCAT62(uVar11,sVar48);
  auVar55._8_4_ = 0;
  auVar55._0_8_ = uVar43;
  auVar55._12_2_ = uVar82;
  auVar55._14_2_ = uVar82;
  uVar82 = (undefined2)((ulong)uVar10 >> 0x20);
  auVar54._12_4_ = auVar55._12_4_;
  auVar54._8_2_ = 0;
  auVar54._0_8_ = uVar43;
  auVar54._10_2_ = uVar82;
  auVar53._10_6_ = auVar54._10_6_;
  auVar53._8_2_ = uVar82;
  auVar53._0_8_ = uVar43;
  uVar82 = (undefined2)uVar11;
  auVar13._4_8_ = auVar53._8_8_;
  auVar13._2_2_ = uVar82;
  auVar13._0_2_ = uVar82;
  fVar142 = (float)((int)sVar48 >> 8);
  fVar156 = (float)(auVar13._0_4_ >> 0x18);
  fVar159 = (float)(auVar53._8_4_ >> 0x18);
  uVar5 = *(undefined4 *)(prim + uVar33 * 6 + 6);
  uVar81 = (undefined1)((uint)uVar5 >> 0x18);
  uVar82 = CONCAT11(uVar81,uVar81);
  uVar81 = (undefined1)((uint)uVar5 >> 0x10);
  uVar10 = CONCAT35(CONCAT21(uVar82,uVar81),CONCAT14(uVar81,uVar5));
  uVar81 = (undefined1)((uint)uVar5 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar10 >> 0x20),uVar81),uVar81);
  sVar48 = CONCAT11((char)uVar5,(char)uVar5);
  uVar43 = CONCAT62(uVar11,sVar48);
  auVar58._8_4_ = 0;
  auVar58._0_8_ = uVar43;
  auVar58._12_2_ = uVar82;
  auVar58._14_2_ = uVar82;
  uVar82 = (undefined2)((ulong)uVar10 >> 0x20);
  auVar57._12_4_ = auVar58._12_4_;
  auVar57._8_2_ = 0;
  auVar57._0_8_ = uVar43;
  auVar57._10_2_ = uVar82;
  auVar56._10_6_ = auVar57._10_6_;
  auVar56._8_2_ = uVar82;
  auVar56._0_8_ = uVar43;
  uVar82 = (undefined2)uVar11;
  auVar14._4_8_ = auVar56._8_8_;
  auVar14._2_2_ = uVar82;
  auVar14._0_2_ = uVar82;
  fVar183 = (float)((int)sVar48 >> 8);
  fVar189 = (float)(auVar14._0_4_ >> 0x18);
  fVar191 = (float)(auVar56._8_4_ >> 0x18);
  uVar5 = *(undefined4 *)(prim + uVar33 * 0xb + 6);
  uVar81 = (undefined1)((uint)uVar5 >> 0x18);
  uVar82 = CONCAT11(uVar81,uVar81);
  uVar81 = (undefined1)((uint)uVar5 >> 0x10);
  uVar10 = CONCAT35(CONCAT21(uVar82,uVar81),CONCAT14(uVar81,uVar5));
  uVar81 = (undefined1)((uint)uVar5 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar10 >> 0x20),uVar81),uVar81);
  sVar48 = CONCAT11((char)uVar5,(char)uVar5);
  uVar43 = CONCAT62(uVar11,sVar48);
  auVar61._8_4_ = 0;
  auVar61._0_8_ = uVar43;
  auVar61._12_2_ = uVar82;
  auVar61._14_2_ = uVar82;
  uVar82 = (undefined2)((ulong)uVar10 >> 0x20);
  auVar60._12_4_ = auVar61._12_4_;
  auVar60._8_2_ = 0;
  auVar60._0_8_ = uVar43;
  auVar60._10_2_ = uVar82;
  auVar59._10_6_ = auVar60._10_6_;
  auVar59._8_2_ = uVar82;
  auVar59._0_8_ = uVar43;
  uVar82 = (undefined2)uVar11;
  auVar15._4_8_ = auVar59._8_8_;
  auVar15._2_2_ = uVar82;
  auVar15._0_2_ = uVar82;
  fVar49 = (float)((int)sVar48 >> 8);
  fVar83 = (float)(auVar15._0_4_ >> 0x18);
  fVar87 = (float)(auVar59._8_4_ >> 0x18);
  uVar5 = *(undefined4 *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6);
  uVar81 = (undefined1)((uint)uVar5 >> 0x18);
  uVar82 = CONCAT11(uVar81,uVar81);
  uVar81 = (undefined1)((uint)uVar5 >> 0x10);
  uVar10 = CONCAT35(CONCAT21(uVar82,uVar81),CONCAT14(uVar81,uVar5));
  uVar81 = (undefined1)((uint)uVar5 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar10 >> 0x20),uVar81),uVar81);
  sVar48 = CONCAT11((char)uVar5,(char)uVar5);
  uVar43 = CONCAT62(uVar11,sVar48);
  auVar168._8_4_ = 0;
  auVar168._0_8_ = uVar43;
  auVar168._12_2_ = uVar82;
  auVar168._14_2_ = uVar82;
  uVar82 = (undefined2)((ulong)uVar10 >> 0x20);
  auVar167._12_4_ = auVar168._12_4_;
  auVar167._8_2_ = 0;
  auVar167._0_8_ = uVar43;
  auVar167._10_2_ = uVar82;
  auVar166._10_6_ = auVar167._10_6_;
  auVar166._8_2_ = uVar82;
  auVar166._0_8_ = uVar43;
  uVar82 = (undefined2)uVar11;
  auVar16._4_8_ = auVar166._8_8_;
  auVar16._2_2_ = uVar82;
  auVar16._0_2_ = uVar82;
  fVar164 = (float)((int)sVar48 >> 8);
  fVar178 = (float)(auVar16._0_4_ >> 0x18);
  fVar180 = (float)(auVar166._8_4_ >> 0x18);
  uVar5 = *(undefined4 *)(prim + (uint)(byte)PVar4 * 0xc + uVar33 + 6);
  uVar81 = (undefined1)((uint)uVar5 >> 0x18);
  uVar82 = CONCAT11(uVar81,uVar81);
  uVar81 = (undefined1)((uint)uVar5 >> 0x10);
  uVar10 = CONCAT35(CONCAT21(uVar82,uVar81),CONCAT14(uVar81,uVar5));
  uVar81 = (undefined1)((uint)uVar5 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar10 >> 0x20),uVar81),uVar81);
  sVar48 = CONCAT11((char)uVar5,(char)uVar5);
  uVar43 = CONCAT62(uVar11,sVar48);
  auVar197._8_4_ = 0;
  auVar197._0_8_ = uVar43;
  auVar197._12_2_ = uVar82;
  auVar197._14_2_ = uVar82;
  uVar82 = (undefined2)((ulong)uVar10 >> 0x20);
  auVar196._12_4_ = auVar197._12_4_;
  auVar196._8_2_ = 0;
  auVar196._0_8_ = uVar43;
  auVar196._10_2_ = uVar82;
  auVar195._10_6_ = auVar196._10_6_;
  auVar195._8_2_ = uVar82;
  auVar195._0_8_ = uVar43;
  uVar82 = (undefined2)uVar11;
  auVar17._4_8_ = auVar195._8_8_;
  auVar17._2_2_ = uVar82;
  auVar17._0_2_ = uVar82;
  fVar220 = (float)((int)sVar48 >> 8);
  fVar222 = (float)(auVar17._0_4_ >> 0x18);
  fVar223 = (float)(auVar195._8_4_ >> 0x18);
  uVar41 = (ulong)(uint)((int)(uVar33 * 9) * 2);
  uVar5 = *(undefined4 *)(prim + uVar41 + 6);
  uVar81 = (undefined1)((uint)uVar5 >> 0x18);
  uVar82 = CONCAT11(uVar81,uVar81);
  uVar81 = (undefined1)((uint)uVar5 >> 0x10);
  uVar10 = CONCAT35(CONCAT21(uVar82,uVar81),CONCAT14(uVar81,uVar5));
  uVar81 = (undefined1)((uint)uVar5 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar10 >> 0x20),uVar81),uVar81);
  sVar48 = CONCAT11((char)uVar5,(char)uVar5);
  uVar43 = CONCAT62(uVar11,sVar48);
  auVar200._8_4_ = 0;
  auVar200._0_8_ = uVar43;
  auVar200._12_2_ = uVar82;
  auVar200._14_2_ = uVar82;
  uVar82 = (undefined2)((ulong)uVar10 >> 0x20);
  auVar199._12_4_ = auVar200._12_4_;
  auVar199._8_2_ = 0;
  auVar199._0_8_ = uVar43;
  auVar199._10_2_ = uVar82;
  auVar198._10_6_ = auVar199._10_6_;
  auVar198._8_2_ = uVar82;
  auVar198._0_8_ = uVar43;
  uVar82 = (undefined2)uVar11;
  auVar18._4_8_ = auVar198._8_8_;
  auVar18._2_2_ = uVar82;
  auVar18._0_2_ = uVar82;
  fVar214 = (float)((int)sVar48 >> 8);
  fVar218 = (float)(auVar18._0_4_ >> 0x18);
  fVar219 = (float)(auVar198._8_4_ >> 0x18);
  uVar5 = *(undefined4 *)(prim + uVar41 + uVar33 + 6);
  uVar81 = (undefined1)((uint)uVar5 >> 0x18);
  uVar82 = CONCAT11(uVar81,uVar81);
  uVar81 = (undefined1)((uint)uVar5 >> 0x10);
  uVar10 = CONCAT35(CONCAT21(uVar82,uVar81),CONCAT14(uVar81,uVar5));
  uVar81 = (undefined1)((uint)uVar5 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar10 >> 0x20),uVar81),uVar81);
  sVar48 = CONCAT11((char)uVar5,(char)uVar5);
  uVar43 = CONCAT62(uVar11,sVar48);
  auVar203._8_4_ = 0;
  auVar203._0_8_ = uVar43;
  auVar203._12_2_ = uVar82;
  auVar203._14_2_ = uVar82;
  uVar82 = (undefined2)((ulong)uVar10 >> 0x20);
  auVar202._12_4_ = auVar203._12_4_;
  auVar202._8_2_ = 0;
  auVar202._0_8_ = uVar43;
  auVar202._10_2_ = uVar82;
  auVar201._10_6_ = auVar202._10_6_;
  auVar201._8_2_ = uVar82;
  auVar201._0_8_ = uVar43;
  uVar82 = (undefined2)uVar11;
  auVar19._4_8_ = auVar201._8_8_;
  auVar19._2_2_ = uVar82;
  auVar19._0_2_ = uVar82;
  fVar224 = (float)((int)sVar48 >> 8);
  fVar225 = (float)(auVar19._0_4_ >> 0x18);
  fVar226 = (float)(auVar201._8_4_ >> 0x18);
  uVar38 = (ulong)(uint)((int)(uVar33 * 5) << 2);
  uVar5 = *(undefined4 *)(prim + uVar38 + 6);
  uVar81 = (undefined1)((uint)uVar5 >> 0x18);
  uVar82 = CONCAT11(uVar81,uVar81);
  uVar81 = (undefined1)((uint)uVar5 >> 0x10);
  uVar10 = CONCAT35(CONCAT21(uVar82,uVar81),CONCAT14(uVar81,uVar5));
  uVar81 = (undefined1)((uint)uVar5 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar10 >> 0x20),uVar81),uVar81);
  sVar48 = CONCAT11((char)uVar5,(char)uVar5);
  uVar43 = CONCAT62(uVar11,sVar48);
  auVar231._8_4_ = 0;
  auVar231._0_8_ = uVar43;
  auVar231._12_2_ = uVar82;
  auVar231._14_2_ = uVar82;
  uVar82 = (undefined2)((ulong)uVar10 >> 0x20);
  auVar230._12_4_ = auVar231._12_4_;
  auVar230._8_2_ = 0;
  auVar230._0_8_ = uVar43;
  auVar230._10_2_ = uVar82;
  auVar229._10_6_ = auVar230._10_6_;
  auVar229._8_2_ = uVar82;
  auVar229._0_8_ = uVar43;
  uVar82 = (undefined2)uVar11;
  auVar20._4_8_ = auVar229._8_8_;
  auVar20._2_2_ = uVar82;
  auVar20._0_2_ = uVar82;
  fVar50 = (float)((int)sVar48 >> 8);
  fVar84 = (float)(auVar20._0_4_ >> 0x18);
  fVar88 = (float)(auVar229._8_4_ >> 0x18);
  fVar243 = fVar114 * fVar93 + fVar120 * fVar142 + fVar122 * fVar183;
  fVar251 = fVar114 * fVar109 + fVar120 * fVar156 + fVar122 * fVar189;
  fVar254 = fVar114 * fVar111 + fVar120 * fVar159 + fVar122 * fVar191;
  fVar257 = fVar114 * (float)(auVar171._12_4_ >> 0x18) +
            fVar120 * (float)(auVar54._12_4_ >> 0x18) + fVar122 * (float)(auVar57._12_4_ >> 0x18);
  fVar227 = fVar114 * fVar49 + fVar120 * fVar164 + fVar122 * fVar220;
  fVar235 = fVar114 * fVar83 + fVar120 * fVar178 + fVar122 * fVar222;
  fVar237 = fVar114 * fVar87 + fVar120 * fVar180 + fVar122 * fVar223;
  fVar240 = fVar114 * (float)(auVar60._12_4_ >> 0x18) +
            fVar120 * (float)(auVar167._12_4_ >> 0x18) + fVar122 * (float)(auVar196._12_4_ >> 0x18);
  fVar194 = fVar114 * fVar214 + fVar120 * fVar224 + fVar122 * fVar50;
  fVar212 = fVar114 * fVar218 + fVar120 * fVar225 + fVar122 * fVar84;
  fVar213 = fVar114 * fVar219 + fVar120 * fVar226 + fVar122 * fVar88;
  fVar114 = fVar114 * (float)(auVar199._12_4_ >> 0x18) +
            fVar120 * (float)(auVar202._12_4_ >> 0x18) + fVar122 * (float)(auVar230._12_4_ >> 0x18);
  uVar5 = *(undefined4 *)(ray + k * 4 + 0x30);
  fVar142 = fVar93 * fVar125 + fVar142 * fVar134 + fVar183 * fVar137;
  fVar156 = fVar109 * fVar125 + fVar156 * fVar134 + fVar189 * fVar137;
  fVar159 = fVar111 * fVar125 + fVar159 * fVar134 + fVar191 * fVar137;
  fVar183 = (float)(auVar171._12_4_ >> 0x18) * fVar125 +
            (float)(auVar54._12_4_ >> 0x18) * fVar134 + (float)(auVar57._12_4_ >> 0x18) * fVar137;
  fVar189 = fVar49 * fVar125 + fVar164 * fVar134 + fVar220 * fVar137;
  fVar191 = fVar83 * fVar125 + fVar178 * fVar134 + fVar222 * fVar137;
  fVar220 = fVar87 * fVar125 + fVar180 * fVar134 + fVar223 * fVar137;
  fVar222 = (float)(auVar60._12_4_ >> 0x18) * fVar125 +
            (float)(auVar167._12_4_ >> 0x18) * fVar134 + (float)(auVar196._12_4_ >> 0x18) * fVar137;
  fVar164 = fVar125 * fVar214 + fVar134 * fVar224 + fVar137 * fVar50;
  fVar178 = fVar125 * fVar218 + fVar134 * fVar225 + fVar137 * fVar84;
  fVar180 = fVar125 * fVar219 + fVar134 * fVar226 + fVar137 * fVar88;
  fVar125 = fVar125 * (float)(auVar199._12_4_ >> 0x18) +
            fVar134 * (float)(auVar202._12_4_ >> 0x18) + fVar137 * (float)(auVar230._12_4_ >> 0x18);
  fVar122 = (float)DAT_01f80d30;
  fVar49 = DAT_01f80d30._4_4_;
  fVar50 = DAT_01f80d30._8_4_;
  fVar83 = DAT_01f80d30._12_4_;
  uVar44 = -(uint)(fVar122 <= ABS(fVar243));
  uVar45 = -(uint)(fVar49 <= ABS(fVar251));
  uVar46 = -(uint)(fVar50 <= ABS(fVar254));
  uVar47 = -(uint)(fVar83 <= ABS(fVar257));
  auVar246._0_4_ = (uint)fVar243 & uVar44;
  auVar246._4_4_ = (uint)fVar251 & uVar45;
  auVar246._8_4_ = (uint)fVar254 & uVar46;
  auVar246._12_4_ = (uint)fVar257 & uVar47;
  auVar145._0_4_ = ~uVar44 & (uint)fVar122;
  auVar145._4_4_ = ~uVar45 & (uint)fVar49;
  auVar145._8_4_ = ~uVar46 & (uint)fVar50;
  auVar145._12_4_ = ~uVar47 & (uint)fVar83;
  auVar145 = auVar145 | auVar246;
  uVar44 = -(uint)(fVar122 <= ABS(fVar227));
  uVar45 = -(uint)(fVar49 <= ABS(fVar235));
  uVar46 = -(uint)(fVar50 <= ABS(fVar237));
  uVar47 = -(uint)(fVar83 <= ABS(fVar240));
  auVar232._0_4_ = (uint)fVar227 & uVar44;
  auVar232._4_4_ = (uint)fVar235 & uVar45;
  auVar232._8_4_ = (uint)fVar237 & uVar46;
  auVar232._12_4_ = (uint)fVar240 & uVar47;
  auVar169._0_4_ = ~uVar44 & (uint)fVar122;
  auVar169._4_4_ = ~uVar45 & (uint)fVar49;
  auVar169._8_4_ = ~uVar46 & (uint)fVar50;
  auVar169._12_4_ = ~uVar47 & (uint)fVar83;
  auVar169 = auVar169 | auVar232;
  uVar44 = -(uint)(fVar122 <= ABS(fVar194));
  uVar45 = -(uint)(fVar49 <= ABS(fVar212));
  uVar46 = -(uint)(fVar50 <= ABS(fVar213));
  uVar47 = -(uint)(fVar83 <= ABS(fVar114));
  auVar204._0_4_ = (uint)fVar194 & uVar44;
  auVar204._4_4_ = (uint)fVar212 & uVar45;
  auVar204._8_4_ = (uint)fVar213 & uVar46;
  auVar204._12_4_ = (uint)fVar114 & uVar47;
  auVar185._0_4_ = ~uVar44 & (uint)fVar122;
  auVar185._4_4_ = ~uVar45 & (uint)fVar49;
  auVar185._8_4_ = ~uVar46 & (uint)fVar50;
  auVar185._12_4_ = ~uVar47 & (uint)fVar83;
  auVar185 = auVar185 | auVar204;
  auVar62 = rcpps(_DAT_01f80d30,auVar145);
  fVar122 = auVar62._0_4_;
  fVar83 = auVar62._4_4_;
  fVar88 = auVar62._8_4_;
  fVar111 = auVar62._12_4_;
  fVar122 = (1.0 - auVar145._0_4_ * fVar122) * fVar122 + fVar122;
  fVar83 = (1.0 - auVar145._4_4_ * fVar83) * fVar83 + fVar83;
  fVar88 = (1.0 - auVar145._8_4_ * fVar88) * fVar88 + fVar88;
  fVar111 = (1.0 - auVar145._12_4_ * fVar111) * fVar111 + fVar111;
  auVar62 = rcpps(auVar62,auVar169);
  fVar49 = auVar62._0_4_;
  fVar84 = auVar62._4_4_;
  fVar93 = auVar62._8_4_;
  fVar114 = auVar62._12_4_;
  fVar49 = (1.0 - auVar169._0_4_ * fVar49) * fVar49 + fVar49;
  fVar84 = (1.0 - auVar169._4_4_ * fVar84) * fVar84 + fVar84;
  fVar93 = (1.0 - auVar169._8_4_ * fVar93) * fVar93 + fVar93;
  fVar114 = (1.0 - auVar169._12_4_ * fVar114) * fVar114 + fVar114;
  auVar62 = rcpps(auVar62,auVar185);
  fVar50 = auVar62._0_4_;
  fVar87 = auVar62._4_4_;
  fVar109 = auVar62._8_4_;
  fVar120 = auVar62._12_4_;
  fVar50 = (1.0 - auVar185._0_4_ * fVar50) * fVar50 + fVar50;
  fVar87 = (1.0 - auVar185._4_4_ * fVar87) * fVar87 + fVar87;
  fVar109 = (1.0 - auVar185._8_4_ * fVar109) * fVar109 + fVar109;
  fVar120 = (1.0 - auVar185._12_4_ * fVar120) * fVar120 + fVar120;
  uVar43 = *(ulong *)(prim + uVar33 * 7 + 6);
  uVar82 = (undefined2)(uVar43 >> 0x30);
  auVar65._8_4_ = 0;
  auVar65._0_8_ = uVar43;
  auVar65._12_2_ = uVar82;
  auVar65._14_2_ = uVar82;
  uVar82 = (undefined2)(uVar43 >> 0x20);
  auVar64._12_4_ = auVar65._12_4_;
  auVar64._8_2_ = 0;
  auVar64._0_8_ = uVar43;
  auVar64._10_2_ = uVar82;
  auVar63._10_6_ = auVar64._10_6_;
  auVar63._8_2_ = uVar82;
  auVar63._0_8_ = uVar43;
  uVar82 = (undefined2)(uVar43 >> 0x10);
  auVar21._4_8_ = auVar63._8_8_;
  auVar21._2_2_ = uVar82;
  auVar21._0_2_ = uVar82;
  auVar146._0_8_ =
       CONCAT44(((float)(auVar21._0_4_ >> 0x10) - fVar156) * fVar83,
                ((float)(int)(short)uVar43 - fVar142) * fVar122);
  auVar146._8_4_ = ((float)(auVar63._8_4_ >> 0x10) - fVar159) * fVar88;
  auVar146._12_4_ = ((float)(auVar64._12_4_ >> 0x10) - fVar183) * fVar111;
  uVar43 = *(ulong *)(prim + uVar33 * 9 + 6);
  uVar82 = (undefined2)(uVar43 >> 0x30);
  auVar68._8_4_ = 0;
  auVar68._0_8_ = uVar43;
  auVar68._12_2_ = uVar82;
  auVar68._14_2_ = uVar82;
  uVar82 = (undefined2)(uVar43 >> 0x20);
  auVar67._12_4_ = auVar68._12_4_;
  auVar67._8_2_ = 0;
  auVar67._0_8_ = uVar43;
  auVar67._10_2_ = uVar82;
  auVar66._10_6_ = auVar67._10_6_;
  auVar66._8_2_ = uVar82;
  auVar66._0_8_ = uVar43;
  uVar82 = (undefined2)(uVar43 >> 0x10);
  auVar22._4_8_ = auVar66._8_8_;
  auVar22._2_2_ = uVar82;
  auVar22._0_2_ = uVar82;
  auVar186._0_4_ = ((float)(int)(short)uVar43 - fVar142) * fVar122;
  auVar186._4_4_ = ((float)(auVar22._0_4_ >> 0x10) - fVar156) * fVar83;
  auVar186._8_4_ = ((float)(auVar66._8_4_ >> 0x10) - fVar159) * fVar88;
  auVar186._12_4_ = ((float)(auVar67._12_4_ >> 0x10) - fVar183) * fVar111;
  uVar43 = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + 6);
  uVar41 = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + uVar33 * -2 + 6);
  uVar82 = (undefined2)(uVar41 >> 0x30);
  auVar97._8_4_ = 0;
  auVar97._0_8_ = uVar41;
  auVar97._12_2_ = uVar82;
  auVar97._14_2_ = uVar82;
  uVar82 = (undefined2)(uVar41 >> 0x20);
  auVar96._12_4_ = auVar97._12_4_;
  auVar96._8_2_ = 0;
  auVar96._0_8_ = uVar41;
  auVar96._10_2_ = uVar82;
  auVar95._10_6_ = auVar96._10_6_;
  auVar95._8_2_ = uVar82;
  auVar95._0_8_ = uVar41;
  uVar82 = (undefined2)(uVar41 >> 0x10);
  auVar23._4_8_ = auVar95._8_8_;
  auVar23._2_2_ = uVar82;
  auVar23._0_2_ = uVar82;
  auVar98._0_8_ =
       CONCAT44(((float)(auVar23._0_4_ >> 0x10) - fVar191) * fVar84,
                ((float)(int)(short)uVar41 - fVar189) * fVar49);
  auVar98._8_4_ = ((float)(auVar95._8_4_ >> 0x10) - fVar220) * fVar93;
  auVar98._12_4_ = ((float)(auVar96._12_4_ >> 0x10) - fVar222) * fVar114;
  uVar82 = (undefined2)(uVar43 >> 0x30);
  auVar71._8_4_ = 0;
  auVar71._0_8_ = uVar43;
  auVar71._12_2_ = uVar82;
  auVar71._14_2_ = uVar82;
  uVar82 = (undefined2)(uVar43 >> 0x20);
  auVar70._12_4_ = auVar71._12_4_;
  auVar70._8_2_ = 0;
  auVar70._0_8_ = uVar43;
  auVar70._10_2_ = uVar82;
  auVar69._10_6_ = auVar70._10_6_;
  auVar69._8_2_ = uVar82;
  auVar69._0_8_ = uVar43;
  uVar82 = (undefined2)(uVar43 >> 0x10);
  auVar24._4_8_ = auVar69._8_8_;
  auVar24._2_2_ = uVar82;
  auVar24._0_2_ = uVar82;
  auVar215._0_4_ = ((float)(int)(short)uVar43 - fVar189) * fVar49;
  auVar215._4_4_ = ((float)(auVar24._0_4_ >> 0x10) - fVar191) * fVar84;
  auVar215._8_4_ = ((float)(auVar69._8_4_ >> 0x10) - fVar220) * fVar93;
  auVar215._12_4_ = ((float)(auVar70._12_4_ >> 0x10) - fVar222) * fVar114;
  uVar43 = *(ulong *)(prim + uVar38 + uVar33 + 6);
  uVar82 = (undefined2)(uVar43 >> 0x30);
  auVar74._8_4_ = 0;
  auVar74._0_8_ = uVar43;
  auVar74._12_2_ = uVar82;
  auVar74._14_2_ = uVar82;
  uVar82 = (undefined2)(uVar43 >> 0x20);
  auVar73._12_4_ = auVar74._12_4_;
  auVar73._8_2_ = 0;
  auVar73._0_8_ = uVar43;
  auVar73._10_2_ = uVar82;
  auVar72._10_6_ = auVar73._10_6_;
  auVar72._8_2_ = uVar82;
  auVar72._0_8_ = uVar43;
  uVar82 = (undefined2)(uVar43 >> 0x10);
  auVar25._4_8_ = auVar72._8_8_;
  auVar25._2_2_ = uVar82;
  auVar25._0_2_ = uVar82;
  auVar75._0_8_ =
       CONCAT44(((float)(auVar25._0_4_ >> 0x10) - fVar178) * fVar87,
                ((float)(int)(short)uVar43 - fVar164) * fVar50);
  auVar75._8_4_ = ((float)(auVar72._8_4_ >> 0x10) - fVar180) * fVar109;
  auVar75._12_4_ = ((float)(auVar73._12_4_ >> 0x10) - fVar125) * fVar120;
  uVar43 = *(ulong *)(prim + uVar33 * 0x17 + 6);
  uVar82 = (undefined2)(uVar43 >> 0x30);
  auVar207._8_4_ = 0;
  auVar207._0_8_ = uVar43;
  auVar207._12_2_ = uVar82;
  auVar207._14_2_ = uVar82;
  uVar82 = (undefined2)(uVar43 >> 0x20);
  auVar206._12_4_ = auVar207._12_4_;
  auVar206._8_2_ = 0;
  auVar206._0_8_ = uVar43;
  auVar206._10_2_ = uVar82;
  auVar205._10_6_ = auVar206._10_6_;
  auVar205._8_2_ = uVar82;
  auVar205._0_8_ = uVar43;
  uVar82 = (undefined2)(uVar43 >> 0x10);
  auVar26._4_8_ = auVar205._8_8_;
  auVar26._2_2_ = uVar82;
  auVar26._0_2_ = uVar82;
  auVar210._0_4_ = ((float)(int)(short)uVar43 - fVar164) * fVar50;
  auVar210._4_4_ = ((float)(auVar26._0_4_ >> 0x10) - fVar178) * fVar87;
  auVar210._8_4_ = ((float)(auVar205._8_4_ >> 0x10) - fVar180) * fVar109;
  auVar210._12_4_ = ((float)(auVar206._12_4_ >> 0x10) - fVar125) * fVar120;
  auVar170._8_4_ = auVar146._8_4_;
  auVar170._0_8_ = auVar146._0_8_;
  auVar170._12_4_ = auVar146._12_4_;
  auVar171 = minps(auVar170,auVar186);
  auVar115._8_4_ = auVar98._8_4_;
  auVar115._0_8_ = auVar98._0_8_;
  auVar115._12_4_ = auVar98._12_4_;
  auVar62 = minps(auVar115,auVar215);
  auVar171 = maxps(auVar171,auVar62);
  auVar116._8_4_ = auVar75._8_4_;
  auVar116._0_8_ = auVar75._0_8_;
  auVar116._12_4_ = auVar75._12_4_;
  auVar62 = minps(auVar116,auVar210);
  auVar128._4_4_ = uVar5;
  auVar128._0_4_ = uVar5;
  auVar128._8_4_ = uVar5;
  auVar128._12_4_ = uVar5;
  auVar62 = maxps(auVar62,auVar128);
  auVar172 = maxps(auVar171,auVar62);
  auVar171 = maxps(auVar146,auVar186);
  auVar62 = maxps(auVar98,auVar215);
  auVar171 = minps(auVar171,auVar62);
  local_48 = auVar172._0_4_ * 0.99999964;
  fStack_44 = auVar172._4_4_ * 0.99999964;
  fStack_40 = auVar172._8_4_ * 0.99999964;
  fStack_3c = auVar172._12_4_ * 0.99999964;
  auVar62 = maxps(auVar75,auVar210);
  uVar5 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar99._4_4_ = uVar5;
  auVar99._0_4_ = uVar5;
  auVar99._8_4_ = uVar5;
  auVar99._12_4_ = uVar5;
  auVar62 = minps(auVar62,auVar99);
  auVar62 = minps(auVar171,auVar62);
  auVar100._0_4_ = -(uint)(PVar4 != (Primitive)0x0 && local_48 <= auVar62._0_4_ * 1.0000004);
  auVar100._4_4_ = -(uint)(1 < (byte)PVar4 && fStack_44 <= auVar62._4_4_ * 1.0000004);
  auVar100._8_4_ = -(uint)(2 < (byte)PVar4 && fStack_40 <= auVar62._8_4_ * 1.0000004);
  auVar100._12_4_ = -(uint)(3 < (byte)PVar4 && fStack_3c <= auVar62._12_4_ * 1.0000004);
  uVar44 = movmskps((uint)(byte)PVar4,auVar100);
  if (uVar44 == 0) {
    bVar40 = false;
  }
  else {
    uVar44 = uVar44 & 0xff;
    local_230 = pre->ray_space + k;
    local_388 = mm_lookupmask_ps._0_8_;
    uStack_380 = mm_lookupmask_ps._8_8_;
    local_320 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
    do {
      uVar43 = (ulong)uVar44;
      lVar9 = 0;
      if (uVar43 != 0) {
        for (; (uVar44 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
        }
      }
      uVar43 = uVar43 - 1 & uVar43;
      uStack_470._0_4_ = *(uint *)(prim + 2);
      local_390 = (ulong)(uint)uStack_470;
      uStack_3d0._0_4_ = *(uint *)(prim + lVar9 * 4 + 6);
      local_2d8 = (ulong)(uint)uStack_3d0;
      pGVar7 = (context->scene->geometries).items[local_390].ptr;
      _Var8 = pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      uVar41 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 + _Var8 * local_2d8);
      pGVar39 = (Geometry *)pGVar7[1].intersectionFilterN;
      lVar9 = *(long *)&pGVar7[1].time_range.upper;
      pfVar1 = (float *)(lVar9 + (long)pGVar39 * uVar41);
      local_2b8 = *pfVar1;
      fStack_2b4 = pfVar1[1];
      local_1b8 = *(undefined8 *)pfVar1;
      fStack_2b0 = pfVar1[2];
      fStack_2ac = pfVar1[3];
      uStack_1b0 = *(undefined8 *)(pfVar1 + 2);
      pfVar1 = (float *)(lVar9 + (uVar41 + 1) * (long)pGVar39);
      local_2c8 = *pfVar1;
      fStack_2c4 = pfVar1[1];
      local_1a8 = *(undefined8 *)pfVar1;
      fStack_2c0 = pfVar1[2];
      fStack_2bc = pfVar1[3];
      uStack_1a0 = *(undefined8 *)(pfVar1 + 2);
      pfVar1 = (float *)(lVar9 + (uVar41 + 2) * (long)pGVar39);
      fVar122 = *pfVar1;
      fVar49 = pfVar1[1];
      fVar50 = pfVar1[2];
      fVar83 = pfVar1[3];
      lVar42 = 0;
      if (uVar43 != 0) {
        for (; (uVar43 >> lVar42 & 1) == 0; lVar42 = lVar42 + 1) {
        }
      }
      pfVar1 = (float *)(lVar9 + (uVar41 + 3) * (long)pGVar39);
      fVar84 = *pfVar1;
      fVar87 = pfVar1[1];
      fVar88 = pfVar1[2];
      fVar93 = pfVar1[3];
      if ((uVar43 != 0) && (uVar41 = uVar43 - 1 & uVar43, uVar41 != 0)) {
        lVar9 = 0;
        if (uVar41 != 0) {
          for (; (uVar41 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
          }
        }
        pGVar39 = (Geometry *)
                  ((long)pGVar39 *
                  (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                                  _Var8 * *(uint *)(prim + lVar9 * 4 + 6)));
      }
      iVar6 = (int)pGVar7[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      fVar109 = *(float *)(ray + k * 4);
      fVar111 = *(float *)(ray + k * 4 + 0x10);
      fVar114 = *(float *)(ray + k * 4 + 0x20);
      fVar134 = local_2b8 - fVar109;
      fVar137 = fStack_2b4 - fVar111;
      fVar189 = fStack_2b0 - fVar114;
      fVar120 = (local_230->vx).field_0.m128[0];
      fVar142 = (local_230->vx).field_0.m128[1];
      fVar156 = (local_230->vx).field_0.m128[2];
      fVar159 = (local_230->vy).field_0.m128[0];
      fVar183 = (local_230->vy).field_0.m128[1];
      fVar164 = (local_230->vy).field_0.m128[2];
      fVar178 = (local_230->vz).field_0.m128[0];
      fVar180 = (local_230->vz).field_0.m128[1];
      fVar125 = (local_230->vz).field_0.m128[2];
      local_258 = fVar134 * fVar120 + fVar137 * fVar159 + fVar189 * fVar178;
      local_298 = fVar134 * fVar142 + fVar137 * fVar183 + fVar189 * fVar180;
      fVar212 = fVar134 * fVar156 + fVar137 * fVar164 + fVar189 * fVar125;
      fVar134 = local_2c8 - fVar109;
      fVar137 = fStack_2c4 - fVar111;
      fVar189 = fStack_2c0 - fVar114;
      local_248 = fVar134 * fVar120 + fVar137 * fVar159 + fVar189 * fVar178;
      local_368 = fVar134 * fVar142 + fVar137 * fVar183 + fVar189 * fVar180;
      local_358 = fVar134 * fVar156 + fVar137 * fVar164 + fVar189 * fVar125;
      fVar134 = fVar122 - fVar109;
      fVar137 = fVar49 - fVar111;
      fVar189 = fVar50 - fVar114;
      fVar191 = fVar134 * fVar120 + fVar137 * fVar159 + fVar189 * fVar178;
      fVar194 = fVar134 * fVar142 + fVar137 * fVar183 + fVar189 * fVar180;
      fVar134 = fVar134 * fVar156 + fVar137 * fVar164 + fVar189 * fVar125;
      fVar109 = fVar84 - fVar109;
      fVar111 = fVar87 - fVar111;
      fVar114 = fVar88 - fVar114;
      fVar120 = fVar109 * fVar120 + fVar111 * fVar159 + fVar114 * fVar178;
      fVar142 = fVar109 * fVar142 + fVar111 * fVar183 + fVar114 * fVar180;
      fVar111 = fVar109 * fVar156 + fVar111 * fVar164 + fVar114 * fVar125;
      auVar265._0_8_ = CONCAT44(local_298,local_258) & 0x7fffffff7fffffff;
      auVar265._8_4_ = ABS(fVar212);
      auVar265._12_4_ = ABS(fStack_2ac);
      auVar147._0_8_ = CONCAT44(local_368,local_248) & 0x7fffffff7fffffff;
      auVar147._8_4_ = ABS(local_358);
      auVar147._12_4_ = ABS(fStack_2bc);
      auVar171 = maxps(auVar265,auVar147);
      auVar173._0_8_ = CONCAT44(fVar194,fVar191) & 0x7fffffff7fffffff;
      auVar173._8_4_ = ABS(fVar134);
      auVar173._12_4_ = ABS(fVar83);
      auVar101._0_8_ = CONCAT44(fVar142,fVar120) & 0x7fffffff7fffffff;
      auVar101._8_4_ = ABS(fVar111);
      auVar101._12_4_ = ABS(fVar93);
      auVar62 = maxps(auVar173,auVar101);
      auVar62 = maxps(auVar171,auVar62);
      fVar109 = auVar62._4_4_;
      if (auVar62._4_4_ <= auVar62._0_4_) {
        fVar109 = auVar62._0_4_;
      }
      auVar266._8_8_ = auVar62._8_8_;
      auVar266._0_8_ = auVar62._8_8_;
      fVar114 = (float)iVar6;
      local_2e8 = ZEXT416((uint)fVar114);
      if (auVar62._8_4_ <= fVar109) {
        auVar266._0_4_ = fVar109;
      }
      lVar9 = (long)iVar6 * 0x44;
      fVar109 = *(float *)*(undefined1 (*) [12])(bspline_basis0 + lVar9 + 0x908);
      fVar156 = *(float *)(bspline_basis0 + lVar9 + 0x90c);
      fVar159 = *(float *)(bspline_basis0 + lVar9 + 0x910);
      auVar12 = *(undefined1 (*) [12])(bspline_basis0 + lVar9 + 0x908);
      fVar183 = *(float *)(bspline_basis0 + lVar9 + 0x914);
      fVar164 = *(float *)(bspline_basis0 + lVar9 + 0xd8c);
      fVar178 = *(float *)(bspline_basis0 + lVar9 + 0xd90);
      fVar180 = *(float *)(bspline_basis0 + lVar9 + 0xd94);
      fVar125 = *(float *)(bspline_basis0 + lVar9 + 0xd98);
      fVar137 = *(float *)*(undefined1 (*) [12])(bspline_basis0 + lVar9 + 0x484);
      fVar189 = *(float *)(bspline_basis0 + lVar9 + 0x488);
      fVar213 = *(float *)(bspline_basis0 + lVar9 + 0x48c);
      auVar13 = *(undefined1 (*) [12])(bspline_basis0 + lVar9 + 0x484);
      fVar214 = *(float *)(bspline_basis0 + lVar9 + 0x490);
      local_268 = *(float *)(bspline_basis0 + lVar9);
      fStack_264 = *(float *)(bspline_basis0 + lVar9 + 4);
      fStack_260 = *(float *)(bspline_basis0 + lVar9 + 8);
      fStack_25c = *(float *)(bspline_basis0 + lVar9 + 0xc);
      fVar244 = local_258 * local_268 + local_248 * fVar137 + fVar191 * fVar109 + fVar120 * fVar164;
      fVar252 = local_258 * fStack_264 + local_248 * fVar189 + fVar191 * fVar156 + fVar120 * fVar178
      ;
      fVar255 = local_258 * fStack_260 + local_248 * fVar213 + fVar191 * fVar159 + fVar120 * fVar180
      ;
      fVar258 = local_258 * fStack_25c + local_248 * fVar214 + fVar191 * fVar183 + fVar120 * fVar125
      ;
      fVar126 = local_298 * local_268 + local_368 * fVar137 + fVar194 * fVar109 + fVar142 * fVar164;
      fStack_334 = local_298 * fStack_264 +
                   local_368 * fVar189 + fVar194 * fVar156 + fVar142 * fVar178;
      fStack_330 = local_298 * fStack_260 +
                   local_368 * fVar213 + fVar194 * fVar159 + fVar142 * fVar180;
      fStack_32c = local_298 * fStack_25c +
                   local_368 * fVar214 + fVar194 * fVar183 + fVar142 * fVar125;
      fVar257 = fStack_2ac * local_268 + fStack_2bc * fVar137 + fVar83 * fVar109 + fVar93 * fVar164;
      fVar121 = fStack_2ac * fStack_264 + fStack_2bc * fVar189 + fVar83 * fVar156 + fVar93 * fVar178
      ;
      auVar216._4_4_ = fVar121;
      auVar216._0_4_ = fVar257;
      fVar123 = fStack_2ac * fStack_260 + fStack_2bc * fVar213 + fVar83 * fVar159 + fVar93 * fVar180
      ;
      fVar124 = fStack_2ac * fStack_25c + fStack_2bc * fVar214 + fVar83 * fVar183 + fVar93 * fVar125
      ;
      fVar156 = *(float *)(bspline_basis1 + lVar9 + 0xd8c);
      fVar159 = *(float *)(bspline_basis1 + lVar9 + 0xd90);
      fVar137 = *(float *)(bspline_basis1 + lVar9 + 0xd94);
      fVar189 = *(float *)(bspline_basis1 + lVar9 + 0xd98);
      fVar213 = *(float *)(bspline_basis1 + lVar9 + 0x908);
      fVar218 = *(float *)(bspline_basis1 + lVar9 + 0x90c);
      fVar219 = *(float *)(bspline_basis1 + lVar9 + 0x910);
      fVar220 = *(float *)(bspline_basis1 + lVar9 + 0x914);
      local_58 = fVar93;
      fStack_54 = fVar93;
      fStack_50 = fVar93;
      fStack_4c = fVar93;
      fVar222 = *(float *)(bspline_basis1 + lVar9 + 0x484);
      fVar223 = *(float *)(bspline_basis1 + lVar9 + 0x488);
      fVar224 = *(float *)(bspline_basis1 + lVar9 + 0x48c);
      fVar225 = *(float *)(bspline_basis1 + lVar9 + 0x490);
      fVar226 = *(float *)(bspline_basis1 + lVar9);
      fVar227 = *(float *)(bspline_basis1 + lVar9 + 4);
      fVar235 = *(float *)(bspline_basis1 + lVar9 + 8);
      fVar237 = *(float *)(bspline_basis1 + lVar9 + 0xc);
      fVar143 = local_258 * fVar226 + local_248 * fVar222 + fVar191 * fVar213 + fVar120 * fVar156;
      fVar157 = local_258 * fVar227 + local_248 * fVar223 + fVar191 * fVar218 + fVar120 * fVar159;
      fVar160 = local_258 * fVar235 + local_248 * fVar224 + fVar191 * fVar219 + fVar120 * fVar137;
      fVar162 = local_258 * fVar237 + local_248 * fVar225 + fVar191 * fVar220 + fVar120 * fVar189;
      fVar240 = local_298 * fVar226 + local_368 * fVar222 + fVar194 * fVar213 + fVar142 * fVar156;
      fVar243 = local_298 * fVar227 + local_368 * fVar223 + fVar194 * fVar218 + fVar142 * fVar159;
      fVar251 = local_298 * fVar235 + local_368 * fVar224 + fVar194 * fVar219 + fVar142 * fVar137;
      fVar254 = local_298 * fVar237 + local_368 * fVar225 + fVar194 * fVar220 + fVar142 * fVar189;
      auVar208._0_4_ =
           fStack_2ac * fVar226 + fStack_2bc * fVar222 + fVar83 * fVar213 + fVar93 * fVar156;
      auVar208._4_4_ =
           fStack_2ac * fVar227 + fStack_2bc * fVar223 + fVar83 * fVar218 + fVar93 * fVar159;
      auVar208._8_4_ =
           fStack_2ac * fVar235 + fStack_2bc * fVar224 + fVar83 * fVar219 + fVar93 * fVar137;
      auVar208._12_4_ =
           fStack_2ac * fVar237 + fStack_2bc * fVar225 + fVar83 * fVar220 + fVar93 * fVar189;
      fVar184 = fVar143 - fVar244;
      fVar190 = fVar157 - fVar252;
      fVar192 = fVar160 - fVar255;
      fVar193 = fVar162 - fVar258;
      fVar144 = fVar240 - fVar126;
      fVar158 = fVar243 - fStack_334;
      fVar161 = fVar251 - fStack_330;
      fVar163 = fVar254 - fStack_32c;
      fVar109 = fVar126 * fVar184 - fVar244 * fVar144;
      fVar135 = fStack_334 * fVar190 - fVar252 * fVar158;
      fVar138 = fStack_330 * fVar192 - fVar255 * fVar161;
      fVar140 = fStack_32c * fVar193 - fVar258 * fVar163;
      auVar216._8_4_ = fVar123;
      auVar216._12_4_ = fVar124;
      auVar62 = maxps(auVar216,auVar208);
      bVar28 = fVar109 * fVar109 <=
               auVar62._0_4_ * auVar62._0_4_ * (fVar184 * fVar184 + fVar144 * fVar144) &&
               0.0 < fVar114;
      auVar129._0_4_ = -(uint)bVar28;
      bVar29 = fVar135 * fVar135 <=
               auVar62._4_4_ * auVar62._4_4_ * (fVar190 * fVar190 + fVar158 * fVar158) &&
               1.0 < fVar114;
      auVar129._4_4_ = -(uint)bVar29;
      bVar27 = fVar138 * fVar138 <=
               auVar62._8_4_ * auVar62._8_4_ * (fVar192 * fVar192 + fVar161 * fVar161) &&
               2.0 < fVar114;
      auVar129._8_4_ = -(uint)bVar27;
      bVar40 = 3.0 < fVar114 &&
               fVar140 * fVar140 <=
               auVar62._12_4_ * auVar62._12_4_ * (fVar193 * fVar193 + fVar163 * fVar163);
      auVar129._12_4_ = -(uint)bVar40;
      register0x00001584 = auVar266._4_12_;
      local_378._0_4_ = auVar266._0_4_ * 4.7683716e-07;
      iVar31 = movmskps(iVar6,auVar129);
      fVar109 = *(float *)(ray + k * 4 + 0x30);
      _local_2a8 = ZEXT416((uint)fVar109);
      fStack_364 = local_368;
      fStack_360 = local_368;
      fStack_35c = local_368;
      fStack_354 = local_358;
      fStack_350 = local_358;
      fStack_34c = local_358;
      fStack_294 = local_298;
      fStack_290 = local_298;
      fStack_28c = local_298;
      fStack_254 = local_258;
      fStack_250 = local_258;
      fStack_24c = local_258;
      fStack_244 = local_248;
      fStack_240 = local_248;
      fStack_23c = local_248;
      local_228 = fStack_2ac;
      fStack_224 = fStack_2ac;
      fStack_220 = fStack_2ac;
      fStack_21c = fStack_2ac;
      local_218 = fStack_2bc;
      fStack_214 = fStack_2bc;
      fStack_210 = fStack_2bc;
      fStack_20c = fStack_2bc;
      local_208 = fVar83;
      fStack_204 = fVar83;
      fStack_200 = fVar83;
      fStack_1fc = fVar83;
      if (iVar31 == 0) {
        bVar40 = false;
        iVar31 = 0;
      }
      else {
        fVar51 = fVar156 * fVar111 + fVar213 * fVar134 + fVar222 * local_358 + fVar226 * fVar212;
        fVar85 = fVar159 * fVar111 + fVar218 * fVar134 + fVar223 * local_358 + fVar227 * fVar212;
        fVar89 = fVar137 * fVar111 + fVar219 * fVar134 + fVar224 * local_358 + fVar235 * fVar212;
        fVar91 = fVar189 * fVar111 + fVar220 * fVar134 + fVar225 * local_358 + fVar237 * fVar212;
        local_3b8 = auVar13._0_4_;
        fStack_3b4 = auVar13._4_4_;
        fStack_3b0 = auVar13._8_4_;
        local_348._0_4_ = auVar12._0_4_;
        local_348._4_4_ = auVar12._4_4_;
        fStack_340 = auVar12._8_4_;
        fVar127 = fVar164 * fVar111 + (float)local_348._0_4_ * fVar134 + local_3b8 * local_358 +
                  local_268 * fVar212;
        fVar136 = fVar178 * fVar111 + (float)local_348._4_4_ * fVar134 + fStack_3b4 * local_358 +
                  fStack_264 * fVar212;
        fVar139 = fVar180 * fVar111 + fStack_340 * fVar134 + fStack_3b0 * local_358 +
                  fStack_260 * fVar212;
        fVar141 = fVar125 * fVar111 + fVar183 * fVar134 + fVar214 * local_358 + fStack_25c * fVar212
        ;
        fVar156 = *(float *)(bspline_basis0 + lVar9 + 0x1210);
        fVar159 = *(float *)(bspline_basis0 + lVar9 + 0x1214);
        fVar183 = *(float *)(bspline_basis0 + lVar9 + 0x1218);
        fVar164 = *(float *)(bspline_basis0 + lVar9 + 0x121c);
        fVar178 = *(float *)(bspline_basis0 + lVar9 + 0x1694);
        fVar180 = *(float *)(bspline_basis0 + lVar9 + 0x1698);
        fVar125 = *(float *)(bspline_basis0 + lVar9 + 0x169c);
        fVar137 = *(float *)(bspline_basis0 + lVar9 + 0x16a0);
        fVar189 = *(float *)(bspline_basis0 + lVar9 + 0x1b18);
        fVar213 = *(float *)(bspline_basis0 + lVar9 + 0x1b1c);
        fVar214 = *(float *)(bspline_basis0 + lVar9 + 0x1b20);
        fVar218 = *(float *)(bspline_basis0 + lVar9 + 0x1b24);
        fVar219 = *(float *)(bspline_basis0 + lVar9 + 0x1f9c);
        fVar220 = *(float *)(bspline_basis0 + lVar9 + 0x1fa0);
        fVar222 = *(float *)(bspline_basis0 + lVar9 + 0x1fa4);
        fVar223 = *(float *)(bspline_basis0 + lVar9 + 0x1fa8);
        fVar228 = local_258 * fVar156 + local_248 * fVar178 + fVar191 * fVar189 + fVar120 * fVar219;
        fVar236 = local_258 * fVar159 + local_248 * fVar180 + fVar191 * fVar213 + fVar120 * fVar220;
        fVar238 = local_258 * fVar183 + local_248 * fVar125 + fVar191 * fVar214 + fVar120 * fVar222;
        fVar241 = local_258 * fVar164 + local_248 * fVar137 + fVar191 * fVar218 + fVar120 * fVar223;
        fVar269 = local_298 * fVar156 + local_368 * fVar178 + fVar194 * fVar189 + fVar142 * fVar219;
        fVar270 = local_298 * fVar159 + local_368 * fVar180 + fVar194 * fVar213 + fVar142 * fVar220;
        fVar271 = local_298 * fVar183 + local_368 * fVar125 + fVar194 * fVar214 + fVar142 * fVar222;
        fVar272 = local_298 * fVar164 + local_368 * fVar137 + fVar194 * fVar218 + fVar142 * fVar223;
        fVar224 = *(float *)(bspline_basis1 + lVar9 + 0x1210);
        fVar225 = *(float *)(bspline_basis1 + lVar9 + 0x1214);
        fVar226 = *(float *)(bspline_basis1 + lVar9 + 0x1218);
        fVar227 = *(float *)(bspline_basis1 + lVar9 + 0x121c);
        fVar235 = *(float *)(bspline_basis1 + lVar9 + 0x1b18);
        fVar237 = *(float *)(bspline_basis1 + lVar9 + 0x1b1c);
        fVar135 = *(float *)(bspline_basis1 + lVar9 + 0x1b20);
        fVar138 = *(float *)(bspline_basis1 + lVar9 + 0x1b24);
        fVar140 = *(float *)(bspline_basis1 + lVar9 + 0x1f9c);
        fVar239 = *(float *)(bspline_basis1 + lVar9 + 0x1fa0);
        fVar242 = *(float *)(bspline_basis1 + lVar9 + 0x1fa4);
        fVar245 = *(float *)(bspline_basis1 + lVar9 + 0x1fa8);
        fVar253 = *(float *)(bspline_basis1 + lVar9 + 0x1694);
        fVar256 = *(float *)(bspline_basis1 + lVar9 + 0x1698);
        fVar259 = *(float *)(bspline_basis1 + lVar9 + 0x169c);
        fVar260 = *(float *)(bspline_basis1 + lVar9 + 0x16a0);
        fVar165 = local_258 * fVar224 + local_248 * fVar253 + fVar191 * fVar235 + fVar120 * fVar140;
        fVar179 = local_258 * fVar225 + local_248 * fVar256 + fVar191 * fVar237 + fVar120 * fVar239;
        fVar181 = local_258 * fVar226 + local_248 * fVar259 + fVar191 * fVar135 + fVar120 * fVar242;
        fVar182 = local_258 * fVar227 + local_248 * fVar260 + fVar191 * fVar138 + fVar120 * fVar245;
        fVar94 = local_298 * fVar224 + local_368 * fVar253 + fVar194 * fVar235 + fVar142 * fVar140;
        fVar110 = local_298 * fVar225 + local_368 * fVar256 + fVar194 * fVar237 + fVar142 * fVar239;
        fVar112 = local_298 * fVar226 + local_368 * fVar259 + fVar194 * fVar135 + fVar142 * fVar242;
        fVar113 = local_298 * fVar227 + local_368 * fVar260 + fVar194 * fVar138 + fVar142 * fVar245;
        uVar52 = (uint)DAT_01f7b6c0;
        uVar86 = DAT_01f7b6c0._4_4_;
        uVar90 = DAT_01f7b6c0._8_4_;
        uVar92 = DAT_01f7b6c0._12_4_;
        auVar247._0_4_ = (uint)fVar228 & uVar52;
        auVar247._4_4_ = (uint)fVar236 & uVar86;
        auVar247._8_4_ = (uint)fVar238 & uVar90;
        auVar247._12_4_ = (uint)fVar241 & uVar92;
        auVar217._0_4_ = (uint)fVar269 & uVar52;
        auVar217._4_4_ = (uint)fVar270 & uVar86;
        auVar217._8_4_ = (uint)fVar271 & uVar90;
        auVar217._12_4_ = (uint)fVar272 & uVar92;
        auVar62 = maxps(auVar247,auVar217);
        auVar261._0_4_ =
             (uint)(fVar156 * fVar212 + fVar178 * local_358 + fVar189 * fVar134 + fVar219 * fVar111)
             & uVar52;
        auVar261._4_4_ =
             (uint)(fVar159 * fVar212 + fVar180 * local_358 + fVar213 * fVar134 + fVar220 * fVar111)
             & uVar86;
        auVar261._8_4_ =
             (uint)(fVar183 * fVar212 + fVar125 * local_358 + fVar214 * fVar134 + fVar222 * fVar111)
             & uVar90;
        auVar261._12_4_ =
             (uint)(fVar164 * fVar212 + fVar137 * local_358 + fVar218 * fVar134 + fVar223 * fVar111)
             & uVar92;
        auVar62 = maxps(auVar62,auVar261);
        uVar44 = -(uint)((float)local_378._0_4_ <= auVar62._0_4_);
        uVar45 = -(uint)((float)local_378._0_4_ <= auVar62._4_4_);
        uVar46 = -(uint)((float)local_378._0_4_ <= auVar62._8_4_);
        uVar47 = -(uint)((float)local_378._0_4_ <= auVar62._12_4_);
        fVar213 = (float)((uint)fVar228 & uVar44 | ~uVar44 & (uint)fVar184);
        fVar218 = (float)((uint)fVar236 & uVar45 | ~uVar45 & (uint)fVar190);
        fVar219 = (float)((uint)fVar238 & uVar46 | ~uVar46 & (uint)fVar192);
        fVar220 = (float)((uint)fVar241 & uVar47 | ~uVar47 & (uint)fVar193);
        fVar222 = (float)(~uVar44 & (uint)fVar144 | (uint)fVar269 & uVar44);
        fVar223 = (float)(~uVar45 & (uint)fVar158 | (uint)fVar270 & uVar45);
        fVar228 = (float)(~uVar46 & (uint)fVar161 | (uint)fVar271 & uVar46);
        fVar236 = (float)(~uVar47 & (uint)fVar163 | (uint)fVar272 & uVar47);
        auVar262._0_4_ = (uint)fVar165 & uVar52;
        auVar262._4_4_ = (uint)fVar179 & uVar86;
        auVar262._8_4_ = (uint)fVar181 & uVar90;
        auVar262._12_4_ = (uint)fVar182 & uVar92;
        auVar221._0_4_ = (uint)fVar94 & uVar52;
        auVar221._4_4_ = (uint)fVar110 & uVar86;
        auVar221._8_4_ = (uint)fVar112 & uVar90;
        auVar221._12_4_ = (uint)fVar113 & uVar92;
        auVar62 = maxps(auVar262,auVar221);
        auVar187._0_4_ =
             (uint)(fVar224 * fVar212 + fVar253 * local_358 + fVar235 * fVar134 + fVar140 * fVar111)
             & uVar52;
        auVar187._4_4_ =
             (uint)(fVar225 * fVar212 + fVar256 * local_358 + fVar237 * fVar134 + fVar239 * fVar111)
             & uVar86;
        auVar187._8_4_ =
             (uint)(fVar226 * fVar212 + fVar259 * local_358 + fVar135 * fVar134 + fVar242 * fVar111)
             & uVar90;
        auVar187._12_4_ =
             (uint)(fVar227 * fVar212 + fVar260 * local_358 + fVar138 * fVar134 + fVar245 * fVar111)
             & uVar92;
        auVar62 = maxps(auVar62,auVar187);
        uVar44 = -(uint)((float)local_378._0_4_ <= auVar62._0_4_);
        uVar45 = -(uint)((float)local_378._0_4_ <= auVar62._4_4_);
        uVar46 = -(uint)((float)local_378._0_4_ <= auVar62._8_4_);
        uVar47 = -(uint)((float)local_378._0_4_ <= auVar62._12_4_);
        fVar178 = (float)((uint)fVar165 & uVar44 | ~uVar44 & (uint)fVar184);
        fVar180 = (float)((uint)fVar179 & uVar45 | ~uVar45 & (uint)fVar190);
        fVar125 = (float)((uint)fVar181 & uVar46 | ~uVar46 & (uint)fVar192);
        fVar137 = (float)((uint)fVar182 & uVar47 | ~uVar47 & (uint)fVar193);
        fVar224 = (float)(~uVar44 & (uint)fVar144 | (uint)fVar94 & uVar44);
        fVar225 = (float)(~uVar45 & (uint)fVar158 | (uint)fVar110 & uVar45);
        fVar226 = (float)(~uVar46 & (uint)fVar161 | (uint)fVar112 & uVar46);
        fVar227 = (float)(~uVar47 & (uint)fVar163 | (uint)fVar113 & uVar47);
        auVar102._0_4_ = fVar222 * fVar222 + fVar213 * fVar213;
        auVar102._4_4_ = fVar223 * fVar223 + fVar218 * fVar218;
        auVar102._8_4_ = fVar228 * fVar228 + fVar219 * fVar219;
        auVar102._12_4_ = fVar236 * fVar236 + fVar220 * fVar220;
        auVar62 = rsqrtps(_DAT_01f7b6c0,auVar102);
        fVar156 = auVar62._0_4_;
        fVar159 = auVar62._4_4_;
        fVar183 = auVar62._8_4_;
        fVar164 = auVar62._12_4_;
        auVar148._0_4_ = fVar156 * fVar156 * auVar102._0_4_ * 0.5 * fVar156;
        auVar148._4_4_ = fVar159 * fVar159 * auVar102._4_4_ * 0.5 * fVar159;
        auVar148._8_4_ = fVar183 * fVar183 * auVar102._8_4_ * 0.5 * fVar183;
        auVar148._12_4_ = fVar164 * fVar164 * auVar102._12_4_ * 0.5 * fVar164;
        fVar235 = fVar156 * 1.5 - auVar148._0_4_;
        fVar237 = fVar159 * 1.5 - auVar148._4_4_;
        fVar135 = fVar183 * 1.5 - auVar148._8_4_;
        fVar158 = fVar164 * 1.5 - auVar148._12_4_;
        auVar103._0_4_ = fVar224 * fVar224 + fVar178 * fVar178;
        auVar103._4_4_ = fVar225 * fVar225 + fVar180 * fVar180;
        auVar103._8_4_ = fVar226 * fVar226 + fVar125 * fVar125;
        auVar103._12_4_ = fVar227 * fVar227 + fVar137 * fVar137;
        auVar62 = rsqrtps(auVar148,auVar103);
        fVar156 = auVar62._0_4_;
        fVar159 = auVar62._4_4_;
        fVar183 = auVar62._8_4_;
        fVar164 = auVar62._12_4_;
        fVar156 = fVar156 * 1.5 - fVar156 * fVar156 * auVar103._0_4_ * 0.5 * fVar156;
        fVar189 = fVar159 * 1.5 - fVar159 * fVar159 * auVar103._4_4_ * 0.5 * fVar159;
        fVar183 = fVar183 * 1.5 - fVar183 * fVar183 * auVar103._8_4_ * 0.5 * fVar183;
        fVar214 = fVar164 * 1.5 - fVar164 * fVar164 * auVar103._12_4_ * 0.5 * fVar164;
        fVar138 = fVar222 * fVar235 * fVar257;
        fVar140 = fVar223 * fVar237 * fVar121;
        fVar144 = fVar228 * fVar135 * fVar123;
        fVar259 = fVar236 * fVar158 * fVar124;
        fVar159 = -fVar213 * fVar235 * fVar257;
        fVar164 = -fVar218 * fVar237 * fVar121;
        fVar213 = -fVar219 * fVar135 * fVar123;
        fVar218 = -fVar220 * fVar158 * fVar124;
        fVar165 = fVar235 * 0.0 * fVar257;
        fVar179 = fVar237 * 0.0 * fVar121;
        fVar181 = fVar135 * 0.0 * fVar123;
        fVar182 = fVar158 * 0.0 * fVar124;
        fVar94 = fVar224 * fVar156 * auVar208._0_4_;
        fVar110 = fVar225 * fVar189 * auVar208._4_4_;
        fVar112 = fVar226 * fVar183 * auVar208._8_4_;
        fVar113 = fVar227 * fVar214 * auVar208._12_4_;
        fVar161 = fVar143 + fVar94;
        fVar163 = fVar157 + fVar110;
        fVar184 = fVar160 + fVar112;
        fVar190 = fVar162 + fVar113;
        fVar225 = -fVar178 * fVar156 * auVar208._0_4_;
        fVar227 = -fVar180 * fVar189 * auVar208._4_4_;
        fVar237 = -fVar125 * fVar183 * auVar208._8_4_;
        fVar158 = -fVar137 * fVar214 * auVar208._12_4_;
        fVar192 = fVar240 + fVar225;
        fVar193 = fVar243 + fVar227;
        fVar239 = fVar251 + fVar237;
        fVar242 = fVar254 + fVar158;
        fVar180 = fVar156 * 0.0 * auVar208._0_4_;
        fVar137 = fVar189 * 0.0 * auVar208._4_4_;
        fVar220 = fVar183 * 0.0 * auVar208._8_4_;
        fVar223 = fVar214 * 0.0 * auVar208._12_4_;
        fVar189 = fVar244 - fVar138;
        fVar214 = fVar252 - fVar140;
        fVar219 = fVar255 - fVar144;
        fVar222 = fVar258 - fVar259;
        fVar245 = fVar51 + fVar180;
        fVar253 = fVar85 + fVar137;
        fVar256 = fVar89 + fVar220;
        fVar260 = fVar91 + fVar223;
        fVar156 = fVar126 - fVar159;
        fVar183 = fStack_334 - fVar164;
        fVar178 = fStack_330 - fVar213;
        fVar125 = fStack_32c - fVar218;
        fVar224 = fVar127 - fVar165;
        fVar226 = fVar136 - fVar179;
        fVar235 = fVar139 - fVar181;
        fVar135 = fVar141 - fVar182;
        uVar44 = -(uint)(0.0 < (fVar156 * (fVar245 - fVar224) - fVar224 * (fVar192 - fVar156)) * 0.0
                               + (fVar224 * (fVar161 - fVar189) - (fVar245 - fVar224) * fVar189) *
                                 0.0 + ((fVar192 - fVar156) * fVar189 -
                                       (fVar161 - fVar189) * fVar156));
        uVar45 = -(uint)(0.0 < (fVar183 * (fVar253 - fVar226) - fVar226 * (fVar193 - fVar183)) * 0.0
                               + (fVar226 * (fVar163 - fVar214) - (fVar253 - fVar226) * fVar214) *
                                 0.0 + ((fVar193 - fVar183) * fVar214 -
                                       (fVar163 - fVar214) * fVar183));
        uVar46 = -(uint)(0.0 < (fVar178 * (fVar256 - fVar235) - fVar235 * (fVar239 - fVar178)) * 0.0
                               + (fVar235 * (fVar184 - fVar219) - (fVar256 - fVar235) * fVar219) *
                                 0.0 + ((fVar239 - fVar178) * fVar219 -
                                       (fVar184 - fVar219) * fVar178));
        uVar47 = -(uint)(0.0 < (fVar125 * (fVar260 - fVar135) - fVar135 * (fVar242 - fVar125)) * 0.0
                               + (fVar135 * (fVar190 - fVar222) - (fVar260 - fVar135) * fVar222) *
                                 0.0 + ((fVar242 - fVar125) * fVar222 -
                                       (fVar190 - fVar222) * fVar125));
        fVar138 = (float)((uint)(fVar143 - fVar94) & uVar44 | ~uVar44 & (uint)(fVar244 + fVar138));
        fVar140 = (float)((uint)(fVar157 - fVar110) & uVar45 | ~uVar45 & (uint)(fVar252 + fVar140));
        fVar143 = (float)((uint)(fVar160 - fVar112) & uVar46 | ~uVar46 & (uint)(fVar255 + fVar144));
        fVar144 = (float)((uint)(fVar162 - fVar113) & uVar47 | ~uVar47 & (uint)(fVar258 + fVar259));
        fVar255 = (float)((uint)(fVar240 - fVar225) & uVar44 | ~uVar44 & (uint)(fVar126 + fVar159));
        fVar258 = (float)((uint)(fVar243 - fVar227) & uVar45 |
                         ~uVar45 & (uint)(fStack_334 + fVar164));
        fVar259 = (float)((uint)(fVar251 - fVar237) & uVar46 |
                         ~uVar46 & (uint)(fStack_330 + fVar213));
        fVar94 = (float)((uint)(fVar254 - fVar158) & uVar47 | ~uVar47 & (uint)(fStack_32c + fVar218)
                        );
        fVar243 = (float)((uint)(fVar51 - fVar180) & uVar44 | ~uVar44 & (uint)(fVar127 + fVar165));
        fVar251 = (float)((uint)(fVar85 - fVar137) & uVar45 | ~uVar45 & (uint)(fVar136 + fVar179));
        fVar254 = (float)((uint)(fVar89 - fVar220) & uVar46 | ~uVar46 & (uint)(fVar139 + fVar181));
        fVar126 = (float)((uint)(fVar91 - fVar223) & uVar47 | ~uVar47 & (uint)(fVar141 + fVar182));
        fVar213 = (float)((uint)fVar189 & uVar44 | ~uVar44 & (uint)fVar161);
        fVar218 = (float)((uint)fVar214 & uVar45 | ~uVar45 & (uint)fVar163);
        fVar220 = (float)((uint)fVar219 & uVar46 | ~uVar46 & (uint)fVar184);
        fVar223 = (float)((uint)fVar222 & uVar47 | ~uVar47 & (uint)fVar190);
        fVar159 = (float)((uint)fVar156 & uVar44 | ~uVar44 & (uint)fVar192);
        fVar164 = (float)((uint)fVar183 & uVar45 | ~uVar45 & (uint)fVar193);
        fVar180 = (float)((uint)fVar178 & uVar46 | ~uVar46 & (uint)fVar239);
        fVar137 = (float)((uint)fVar125 & uVar47 | ~uVar47 & (uint)fVar242);
        fVar225 = (float)((uint)fVar224 & uVar44 | ~uVar44 & (uint)fVar245);
        fVar227 = (float)((uint)fVar226 & uVar45 | ~uVar45 & (uint)fVar253);
        fVar237 = (float)((uint)fVar235 & uVar46 | ~uVar46 & (uint)fVar256);
        fVar240 = (float)((uint)fVar135 & uVar47 | ~uVar47 & (uint)fVar260);
        fVar157 = (float)((uint)fVar161 & uVar44 | ~uVar44 & (uint)fVar189) - fVar138;
        fVar158 = (float)((uint)fVar163 & uVar45 | ~uVar45 & (uint)fVar214) - fVar140;
        fVar160 = (float)((uint)fVar184 & uVar46 | ~uVar46 & (uint)fVar219) - fVar143;
        fVar161 = (float)((uint)fVar190 & uVar47 | ~uVar47 & (uint)fVar222) - fVar144;
        fVar162 = (float)((uint)fVar192 & uVar44 | ~uVar44 & (uint)fVar156) - fVar255;
        fVar163 = (float)((uint)fVar193 & uVar45 | ~uVar45 & (uint)fVar183) - fVar258;
        fVar184 = (float)((uint)fVar239 & uVar46 | ~uVar46 & (uint)fVar178) - fVar259;
        fVar190 = (float)((uint)fVar242 & uVar47 | ~uVar47 & (uint)fVar125) - fVar94;
        fVar224 = (float)((uint)fVar245 & uVar44 | ~uVar44 & (uint)fVar224) - fVar243;
        fVar226 = (float)((uint)fVar253 & uVar45 | ~uVar45 & (uint)fVar226) - fVar251;
        fVar235 = (float)((uint)fVar256 & uVar46 | ~uVar46 & (uint)fVar235) - fVar254;
        fVar135 = (float)((uint)fVar260 & uVar47 | ~uVar47 & (uint)fVar135) - fVar126;
        fVar239 = fVar138 - fVar213;
        fVar242 = fVar140 - fVar218;
        fVar245 = fVar143 - fVar220;
        fVar253 = fVar144 - fVar223;
        fVar189 = fVar255 - fVar159;
        fVar214 = fVar258 - fVar164;
        fVar219 = fVar259 - fVar180;
        fVar222 = fVar94 - fVar137;
        fVar156 = fVar243 - fVar225;
        fVar183 = fVar251 - fVar227;
        fVar178 = fVar254 - fVar237;
        fVar125 = fVar126 - fVar240;
        fVar192 = (fVar255 * fVar224 - fVar243 * fVar162) * 0.0 +
                  (fVar243 * fVar157 - fVar138 * fVar224) * 0.0 +
                  (fVar138 * fVar162 - fVar255 * fVar157);
        fVar193 = (fVar258 * fVar226 - fVar251 * fVar163) * 0.0 +
                  (fVar251 * fVar158 - fVar140 * fVar226) * 0.0 +
                  (fVar140 * fVar163 - fVar258 * fVar158);
        auVar130._4_4_ = fVar193;
        auVar130._0_4_ = fVar192;
        fVar244 = (fVar259 * fVar235 - fVar254 * fVar184) * 0.0 +
                  (fVar254 * fVar160 - fVar143 * fVar235) * 0.0 +
                  (fVar143 * fVar184 - fVar259 * fVar160);
        fVar252 = (fVar94 * fVar135 - fVar126 * fVar190) * 0.0 +
                  (fVar126 * fVar161 - fVar144 * fVar135) * 0.0 +
                  (fVar144 * fVar190 - fVar94 * fVar161);
        auVar267._0_4_ =
             (fVar159 * fVar156 - fVar225 * fVar189) * 0.0 +
             (fVar225 * fVar239 - fVar213 * fVar156) * 0.0 + (fVar213 * fVar189 - fVar159 * fVar239)
        ;
        auVar267._4_4_ =
             (fVar164 * fVar183 - fVar227 * fVar214) * 0.0 +
             (fVar227 * fVar242 - fVar218 * fVar183) * 0.0 + (fVar218 * fVar214 - fVar164 * fVar242)
        ;
        auVar267._8_4_ =
             (fVar180 * fVar178 - fVar237 * fVar219) * 0.0 +
             (fVar237 * fVar245 - fVar220 * fVar178) * 0.0 + (fVar220 * fVar219 - fVar180 * fVar245)
        ;
        auVar267._12_4_ =
             (fVar137 * fVar125 - fVar240 * fVar222) * 0.0 +
             (fVar240 * fVar253 - fVar223 * fVar125) * 0.0 + (fVar223 * fVar222 - fVar137 * fVar253)
        ;
        auVar130._8_4_ = fVar244;
        auVar130._12_4_ = fVar252;
        auVar62 = maxps(auVar130,auVar267);
        bVar28 = auVar62._0_4_ <= 0.0 && bVar28;
        auVar131._0_4_ = -(uint)bVar28;
        bVar29 = auVar62._4_4_ <= 0.0 && bVar29;
        auVar131._4_4_ = -(uint)bVar29;
        bVar27 = auVar62._8_4_ <= 0.0 && bVar27;
        auVar131._8_4_ = -(uint)bVar27;
        bVar40 = auVar62._12_4_ <= 0.0 && bVar40;
        auVar131._12_4_ = -(uint)bVar40;
        iVar31 = movmskps(iVar31,auVar131);
        if (iVar31 == 0) {
LAB_00abef32:
          auVar77._8_8_ = uStack_380;
          auVar77._0_8_ = local_388;
        }
        else {
          fVar213 = fVar189 * fVar224 - fVar156 * fVar162;
          fVar218 = fVar214 * fVar226 - fVar183 * fVar163;
          fVar220 = fVar219 * fVar235 - fVar178 * fVar184;
          fVar223 = fVar222 * fVar135 - fVar125 * fVar190;
          fVar156 = fVar156 * fVar157 - fVar224 * fVar239;
          fVar183 = fVar183 * fVar158 - fVar226 * fVar242;
          fVar178 = fVar178 * fVar160 - fVar235 * fVar245;
          fVar125 = fVar125 * fVar161 - fVar135 * fVar253;
          fVar189 = fVar239 * fVar162 - fVar189 * fVar157;
          fVar214 = fVar242 * fVar163 - fVar214 * fVar158;
          fVar219 = fVar245 * fVar184 - fVar219 * fVar160;
          fVar222 = fVar253 * fVar190 - fVar222 * fVar161;
          auVar149._0_12_ = ZEXT812(0);
          auVar149._12_4_ = 0;
          auVar174._0_4_ = fVar213 * 0.0 + fVar156 * 0.0 + fVar189;
          auVar174._4_4_ = fVar218 * 0.0 + fVar183 * 0.0 + fVar214;
          auVar174._8_4_ = fVar220 * 0.0 + fVar178 * 0.0 + fVar219;
          auVar174._12_4_ = fVar223 * 0.0 + fVar125 * 0.0 + fVar222;
          auVar62 = rcpps(auVar149,auVar174);
          fVar159 = auVar62._0_4_;
          fVar164 = auVar62._4_4_;
          fVar180 = auVar62._8_4_;
          fVar137 = auVar62._12_4_;
          fVar159 = (1.0 - auVar174._0_4_ * fVar159) * fVar159 + fVar159;
          fVar164 = (1.0 - auVar174._4_4_ * fVar164) * fVar164 + fVar164;
          fVar180 = (1.0 - auVar174._8_4_ * fVar180) * fVar180 + fVar180;
          fVar137 = (1.0 - auVar174._12_4_ * fVar137) * fVar137 + fVar137;
          fVar189 = (fVar243 * fVar189 + fVar255 * fVar156 + fVar138 * fVar213) * fVar159;
          fVar183 = (fVar251 * fVar214 + fVar258 * fVar183 + fVar140 * fVar218) * fVar164;
          auVar248._4_4_ = fVar183;
          auVar248._0_4_ = fVar189;
          fVar178 = (fVar254 * fVar219 + fVar259 * fVar178 + fVar143 * fVar220) * fVar180;
          fVar125 = (fVar126 * fVar222 + fVar94 * fVar125 + fVar144 * fVar223) * fVar137;
          fVar156 = *(float *)(ray + k * 4 + 0x80);
          bVar28 = (fVar109 <= fVar189 && fVar189 <= fVar156) && bVar28;
          auVar150._0_4_ = -(uint)bVar28;
          bVar29 = (fVar109 <= fVar183 && fVar183 <= fVar156) && bVar29;
          auVar150._4_4_ = -(uint)bVar29;
          bVar27 = (fVar109 <= fVar178 && fVar178 <= fVar156) && bVar27;
          auVar150._8_4_ = -(uint)bVar27;
          bVar40 = (fVar109 <= fVar125 && fVar125 <= fVar156) && bVar40;
          auVar150._12_4_ = -(uint)bVar40;
          iVar31 = movmskps(iVar31,auVar150);
          if (iVar31 == 0) goto LAB_00abef32;
          auVar151._0_8_ =
               CONCAT44(-(uint)(auVar174._4_4_ != 0.0 && bVar29),
                        -(uint)(auVar174._0_4_ != 0.0 && bVar28));
          auVar151._8_4_ = -(uint)(auVar174._8_4_ != 0.0 && bVar27);
          auVar151._12_4_ = -(uint)(auVar174._12_4_ != 0.0 && bVar40);
          iVar31 = movmskps(iVar31,auVar151);
          auVar77._8_8_ = uStack_380;
          auVar77._0_8_ = local_388;
          if (iVar31 != 0) {
            fVar192 = fVar192 * fVar159;
            fVar193 = fVar193 * fVar164;
            fVar244 = fVar244 * fVar180;
            fVar252 = fVar252 * fVar137;
            auVar76._0_4_ = ~uVar44 & (uint)fVar192;
            auVar76._4_4_ = ~uVar45 & (uint)fVar193;
            auVar76._8_4_ = ~uVar46 & (uint)fVar244;
            auVar76._12_4_ = ~uVar47 & (uint)fVar252;
            auVar209._0_4_ = (uint)(1.0 - fVar192) & uVar44;
            auVar209._4_4_ = (uint)(1.0 - fVar193) & uVar45;
            auVar209._8_4_ = (uint)(1.0 - fVar244) & uVar46;
            auVar209._12_4_ = (uint)(1.0 - fVar252) & uVar47;
            auVar210 = auVar209 | auVar76;
            local_278 = (float)(~uVar44 & (uint)(auVar267._0_4_ * fVar159) |
                               (uint)(1.0 - auVar267._0_4_ * fVar159) & uVar44);
            fStack_274 = (float)(~uVar45 & (uint)(auVar267._4_4_ * fVar164) |
                                (uint)(1.0 - auVar267._4_4_ * fVar164) & uVar45);
            fStack_270 = (float)(~uVar46 & (uint)(auVar267._8_4_ * fVar180) |
                                (uint)(1.0 - auVar267._8_4_ * fVar180) & uVar46);
            fStack_26c = (float)(~uVar47 & (uint)(auVar267._12_4_ * fVar137) |
                                (uint)(1.0 - auVar267._12_4_ * fVar137) & uVar47);
            auVar77._8_4_ = auVar151._8_4_;
            auVar77._0_8_ = auVar151._0_8_;
            auVar77._12_4_ = auVar151._12_4_;
            auVar248._8_4_ = fVar178;
            auVar248._12_4_ = fVar125;
            auVar246 = auVar248;
          }
        }
        iVar31 = movmskps(iVar31,auVar77);
        if (iVar31 == 0) {
          bVar40 = false;
          iVar31 = 0;
        }
        else {
          fVar257 = (auVar208._0_4_ - fVar257) * auVar210._0_4_ + fVar257;
          fVar121 = (auVar208._4_4_ - fVar121) * auVar210._4_4_ + fVar121;
          fVar123 = (auVar208._8_4_ - fVar123) * auVar210._8_4_ + fVar123;
          fVar124 = (auVar208._12_4_ - fVar124) * auVar210._12_4_ + fVar124;
          fVar109 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
          local_178._0_4_ = -(uint)(fVar109 * (fVar257 + fVar257) < auVar246._0_4_) & auVar77._0_4_;
          local_178._4_4_ = -(uint)(fVar109 * (fVar121 + fVar121) < auVar246._4_4_) & auVar77._4_4_;
          local_178._8_4_ = -(uint)(fVar109 * (fVar123 + fVar123) < auVar246._8_4_) & auVar77._8_4_;
          local_178._12_4_ =
               -(uint)(fVar109 * (fVar124 + fVar124) < auVar246._12_4_) & auVar77._12_4_;
          iVar31 = movmskps(iVar31,local_178);
          if (iVar31 != 0) {
            local_278 = local_278 + local_278 + -1.0;
            fStack_274 = fStack_274 + fStack_274 + -1.0;
            fStack_270 = fStack_270 + fStack_270 + -1.0;
            fStack_26c = fStack_26c + fStack_26c + -1.0;
            local_1c8 = 0;
            if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar40 = true, pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar114 = 1.0 / fVar114;
                local_168[0] = fVar114 * (auVar210._0_4_ + 0.0);
                local_168[1] = fVar114 * (auVar210._4_4_ + 1.0);
                local_168[2] = fVar114 * (auVar210._8_4_ + 2.0);
                local_168[3] = fVar114 * (auVar210._12_4_ + 3.0);
                local_158 = CONCAT44(fStack_274,local_278);
                uStack_150 = CONCAT44(fStack_26c,fStack_270);
                local_148 = auVar246;
                pGVar39 = (Geometry *)(ulong)(byte)iVar31;
                uVar41 = 0;
                if (pGVar39 != (Geometry *)0x0) {
                  for (; ((byte)iVar31 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
                  }
                }
                local_478 = CONCAT44((uint)uStack_470,(uint)uStack_470);
                uStack_470._4_4_ = (uint)uStack_470;
                local_3d8 = CONCAT44((uint)uStack_3d0,(uint)uStack_3d0);
                uStack_3d0._4_4_ = (uint)uStack_3d0;
                auVar12 = *(undefined1 (*) [12])*local_320;
                uStack_3dc = (undefined4)((ulong)*(undefined8 *)(*local_320 + 8) >> 0x20);
                local_338 = *(float *)(ray + k * 4 + 0x80);
                _local_348 = auVar129;
                _local_1f8 = auVar210;
                local_1e8 = local_278;
                fStack_1e4 = fStack_274;
                fStack_1e0 = fStack_270;
                fStack_1dc = fStack_26c;
                local_1d8 = auVar246;
                local_1c4 = iVar6;
                local_198 = fVar122;
                fStack_194 = fVar49;
                fStack_190 = fVar50;
                fStack_18c = fVar83;
                local_188 = fVar84;
                fStack_184 = fVar87;
                fStack_180 = fVar88;
                fStack_17c = fVar93;
                do {
                  local_108 = local_168[uVar41];
                  local_f8 = *(undefined4 *)((long)&local_158 + uVar41 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_148 + uVar41 * 4);
                  fVar159 = 1.0 - local_108;
                  fVar109 = local_108 * fVar159 * 4.0;
                  fVar183 = (fVar159 * fVar159 + fVar109) * 0.5;
                  fVar156 = local_108 * local_108 * 0.5;
                  fVar114 = (-local_108 * local_108 - fVar109) * 0.5;
                  local_318.context = context->user;
                  fVar109 = -fVar159 * fVar159 * 0.5;
                  local_138 = fVar109 * local_2b8 +
                              fVar114 * local_2c8 + fVar183 * fVar122 + fVar156 * fVar84;
                  local_128 = fVar109 * fStack_2b4 +
                              fVar114 * fStack_2c4 + fVar183 * fVar49 + fVar156 * fVar87;
                  local_118 = fVar109 * fStack_2b0 +
                              fVar114 * fStack_2c0 + fVar183 * fVar50 + fVar156 * fVar88;
                  fStack_134 = local_138;
                  fStack_130 = local_138;
                  fStack_12c = local_138;
                  fStack_124 = local_128;
                  fStack_120 = local_128;
                  fStack_11c = local_128;
                  fStack_114 = local_118;
                  fStack_110 = local_118;
                  fStack_10c = local_118;
                  fStack_104 = local_108;
                  fStack_100 = local_108;
                  fStack_fc = local_108;
                  uStack_f4 = local_f8;
                  uStack_f0 = local_f8;
                  uStack_ec = local_f8;
                  local_e8 = local_3d8;
                  uStack_e0 = uStack_3d0;
                  local_d8 = local_478;
                  uStack_d0 = uStack_470;
                  local_c8 = (local_318.context)->instID[0];
                  uStack_c4 = local_c8;
                  uStack_c0 = local_c8;
                  uStack_bc = local_c8;
                  local_b8 = (local_318.context)->instPrimID[0];
                  uStack_b4 = local_b8;
                  uStack_b0 = local_b8;
                  uStack_ac = local_b8;
                  local_3a8._12_4_ = uStack_3dc;
                  local_3a8._0_12_ = auVar12;
                  local_318.valid = (int *)local_3a8;
                  local_318.geometryUserPtr = pGVar7->userPtr;
                  local_318.hit = (RTCHitN *)&local_138;
                  local_318.N = 4;
                  p_Var34 = pGVar7->occlusionFilterN;
                  local_318.ray = (RTCRayN *)ray;
                  if (p_Var34 != (RTCFilterFunctionN)0x0) {
                    p_Var34 = (RTCFilterFunctionN)(*p_Var34)(&local_318);
                  }
                  auVar104._0_4_ = -(uint)(local_3a8._0_4_ == 0);
                  auVar104._4_4_ = -(uint)(local_3a8._4_4_ == 0);
                  auVar104._8_4_ = -(uint)(local_3a8._8_4_ == 0);
                  auVar104._12_4_ = -(uint)(local_3a8._12_4_ == 0);
                  uVar44 = movmskps((int)p_Var34,auVar104);
                  pRVar35 = (RTCRayN *)(ulong)(uVar44 ^ 0xf);
                  if ((uVar44 ^ 0xf) == 0) {
                    auVar104 = auVar104 ^ _DAT_01f7ae20;
                  }
                  else {
                    p_Var34 = context->args->filter;
                    if ((p_Var34 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var34)(&local_318);
                    }
                    auVar78._0_4_ = -(uint)(local_3a8._0_4_ == 0);
                    auVar78._4_4_ = -(uint)(local_3a8._4_4_ == 0);
                    auVar78._8_4_ = -(uint)(local_3a8._8_4_ == 0);
                    auVar78._12_4_ = -(uint)(local_3a8._12_4_ == 0);
                    auVar104 = auVar78 ^ _DAT_01f7ae20;
                    *(undefined1 (*) [16])(local_318.ray + 0x80) =
                         ~auVar78 & _DAT_01f7aa00 |
                         *(undefined1 (*) [16])(local_318.ray + 0x80) & auVar78;
                    pRVar35 = local_318.ray;
                  }
                  auVar105._0_4_ = auVar104._0_4_ << 0x1f;
                  auVar105._4_4_ = auVar104._4_4_ << 0x1f;
                  auVar105._8_4_ = auVar104._8_4_ << 0x1f;
                  auVar105._12_4_ = auVar104._12_4_ << 0x1f;
                  iVar32 = movmskps((int)pRVar35,auVar105);
                  iVar31 = (int)uVar41;
                  if (iVar32 != 0) {
                    bVar40 = true;
                    break;
                  }
                  *(float *)(ray + k * 4 + 0x80) = local_338;
                  pGVar39 = (Geometry *)((ulong)pGVar39 ^ 1L << (uVar41 & 0x3f));
                  uVar41 = 0;
                  if (pGVar39 != (Geometry *)0x0) {
                    for (; ((ulong)pGVar39 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
                    }
                  }
                  bVar40 = false;
                } while (pGVar39 != (Geometry *)0x0);
              }
              goto LAB_00abeee7;
            }
          }
          bVar40 = false;
        }
      }
LAB_00abeee7:
      if (4 < iVar6) {
        local_78 = iVar6;
        iStack_74 = iVar6;
        iStack_70 = iVar6;
        iStack_6c = iVar6;
        local_378._4_4_ = local_378._0_4_;
        fStack_370 = (float)local_378._0_4_;
        fStack_36c = (float)local_378._0_4_;
        local_2a8._4_4_ = local_2a8._0_4_;
        fStack_2a0 = (float)local_2a8._0_4_;
        fStack_29c = (float)local_2a8._0_4_;
        local_a8 = 1.0 / (float)local_2e8._0_4_;
        fStack_a4 = local_a8;
        fStack_a0 = local_a8;
        fStack_9c = local_a8;
        local_88 = (undefined4)local_390;
        uStack_84 = (undefined4)local_390;
        uStack_80 = (undefined4)local_390;
        uStack_7c = (undefined4)local_390;
        local_98 = (undefined4)local_2d8;
        uStack_94 = (undefined4)local_2d8;
        uStack_90 = (undefined4)local_2d8;
        uStack_8c = (undefined4)local_2d8;
        lVar42 = 4;
        do {
          local_1c8 = (uint)lVar42;
          pauVar2 = (undefined1 (*) [12])(bspline_basis0 + lVar42 * 4 + lVar9);
          fVar109 = *(float *)*pauVar2;
          fVar114 = *(float *)(*pauVar2 + 4);
          fVar156 = *(float *)(*pauVar2 + 8);
          auVar12 = *pauVar2;
          fVar159 = *(float *)pauVar2[1];
          pfVar1 = (float *)(lVar9 + 0x21aefac + lVar42 * 4);
          local_268 = *pfVar1;
          fStack_264 = pfVar1[1];
          fStack_260 = pfVar1[2];
          fStack_25c = pfVar1[3];
          pfVar1 = (float *)(lVar9 + 0x21af430 + lVar42 * 4);
          fVar183 = *pfVar1;
          fVar164 = pfVar1[1];
          local_2d8 = *(ulong *)pfVar1;
          fStack_2d0 = pfVar1[2];
          fStack_2cc = pfVar1[3];
          pfVar1 = (float *)(lVar9 + 0x21af8b4 + lVar42 * 4);
          fVar178 = *pfVar1;
          fVar180 = pfVar1[1];
          fVar125 = pfVar1[2];
          fVar137 = pfVar1[3];
          local_348._0_4_ =
               local_258 * fVar109 + local_248 * local_268 + fVar191 * fVar183 + fVar120 * fVar178;
          local_348._4_4_ =
               fStack_254 * fVar114 +
               fStack_244 * fStack_264 + fVar191 * fVar164 + fVar120 * fVar180;
          fStack_340 = fStack_250 * fVar156 +
                       fStack_240 * fStack_260 + fVar191 * fStack_2d0 + fVar120 * fVar125;
          fStack_33c = fStack_24c * fVar159 +
                       fStack_23c * fStack_25c + fVar191 * fStack_2cc + fVar120 * fVar137;
          local_338 = local_298 * fVar109 +
                      local_368 * local_268 + fVar194 * fVar183 + fVar142 * fVar178;
          fStack_334 = fStack_294 * fVar114 +
                       fStack_364 * fStack_264 + fVar194 * fVar164 + fVar142 * fVar180;
          fStack_330 = fStack_290 * fVar156 +
                       fStack_360 * fStack_260 + fVar194 * fStack_2d0 + fVar142 * fVar125;
          fStack_32c = fStack_28c * fVar159 +
                       fStack_35c * fStack_25c + fVar194 * fStack_2cc + fVar142 * fVar137;
          auVar211._0_4_ =
               local_228 * fVar109 +
               local_218 * local_268 + local_208 * fVar183 + local_58 * fVar178;
          auVar211._4_4_ =
               fStack_224 * fVar114 +
               fStack_214 * fStack_264 + fStack_204 * fVar164 + fStack_54 * fVar180;
          auVar211._8_4_ =
               fStack_220 * fVar156 +
               fStack_210 * fStack_260 + fStack_200 * fStack_2d0 + fStack_50 * fVar125;
          auVar211._12_4_ =
               fStack_21c * fVar159 +
               fStack_20c * fStack_25c + fStack_1fc * fStack_2cc + fStack_4c * fVar137;
          puVar36 = bspline_basis1 + lVar9;
          pfVar1 = (float *)(puVar36 + lVar42 * 4);
          fVar109 = *pfVar1;
          fVar114 = pfVar1[1];
          fVar156 = pfVar1[2];
          fVar189 = pfVar1[3];
          pfVar1 = (float *)(lVar9 + 0x21b13cc + lVar42 * 4);
          fVar213 = *pfVar1;
          fVar214 = pfVar1[1];
          fVar218 = pfVar1[2];
          fVar219 = pfVar1[3];
          pfVar1 = (float *)(lVar9 + 0x21b1850 + lVar42 * 4);
          fVar220 = *pfVar1;
          fVar222 = pfVar1[1];
          fVar223 = pfVar1[2];
          fVar224 = pfVar1[3];
          pfVar1 = (float *)(lVar9 + 0x21b1cd4 + lVar42 * 4);
          fVar225 = *pfVar1;
          fVar226 = pfVar1[1];
          fVar227 = pfVar1[2];
          fVar235 = pfVar1[3];
          fVar254 = local_258 * fVar109 +
                    local_248 * fVar213 + fVar191 * fVar220 + fVar120 * fVar225;
          fVar121 = fStack_254 * fVar114 +
                    fStack_244 * fVar214 + fVar191 * fVar222 + fVar120 * fVar226;
          fVar124 = fStack_250 * fVar156 +
                    fStack_240 * fVar218 + fVar191 * fVar223 + fVar120 * fVar227;
          fVar135 = fStack_24c * fVar189 +
                    fStack_23c * fVar219 + fVar191 * fVar224 + fVar120 * fVar235;
          fVar140 = local_298 * fVar109 +
                    local_368 * fVar213 + fVar194 * fVar220 + fVar142 * fVar225;
          fVar143 = fStack_294 * fVar114 +
                    fStack_364 * fVar214 + fVar194 * fVar222 + fVar142 * fVar226;
          fVar144 = fStack_290 * fVar156 +
                    fStack_360 * fVar218 + fVar194 * fVar223 + fVar142 * fVar227;
          fVar157 = fStack_28c * fVar189 +
                    fStack_35c * fVar219 + fVar194 * fVar224 + fVar142 * fVar235;
          auVar249._0_4_ =
               local_228 * fVar109 + local_218 * fVar213 + local_208 * fVar220 + local_58 * fVar225;
          auVar249._4_4_ =
               fStack_224 * fVar114 +
               fStack_214 * fVar214 + fStack_204 * fVar222 + fStack_54 * fVar226;
          auVar249._8_4_ =
               fStack_220 * fVar156 +
               fStack_210 * fVar218 + fStack_200 * fVar223 + fStack_50 * fVar227;
          auVar249._12_4_ =
               fStack_21c * fVar189 +
               fStack_20c * fVar219 + fStack_1fc * fVar224 + fStack_4c * fVar235;
          fVar257 = fVar254 - (float)local_348._0_4_;
          fVar123 = fVar121 - (float)local_348._4_4_;
          fVar126 = fVar124 - fStack_340;
          fVar138 = fVar135 - fStack_33c;
          fVar237 = fVar140 - local_338;
          fVar240 = fVar143 - fStack_334;
          fVar243 = fVar144 - fStack_330;
          fVar251 = fVar157 - fStack_32c;
          fVar158 = local_338 * fVar257 - (float)local_348._0_4_ * fVar237;
          fVar160 = fStack_334 * fVar123 - (float)local_348._4_4_ * fVar240;
          fVar161 = fStack_330 * fVar126 - fStack_340 * fVar243;
          fVar162 = fStack_32c * fVar138 - fStack_33c * fVar251;
          auVar62 = maxps(auVar211,auVar249);
          bVar28 = fVar158 * fVar158 <=
                   auVar62._0_4_ * auVar62._0_4_ * (fVar257 * fVar257 + fVar237 * fVar237) &&
                   (int)local_1c8 < local_78;
          local_2e8._0_4_ = -(uint)bVar28;
          bVar27 = (int)(local_1c8 | 1) < iStack_74 &&
                   fVar160 * fVar160 <=
                   auVar62._4_4_ * auVar62._4_4_ * (fVar123 * fVar123 + fVar240 * fVar240);
          local_2e8._4_4_ = -(uint)bVar27;
          bVar29 = fVar161 * fVar161 <=
                   auVar62._8_4_ * auVar62._8_4_ * (fVar126 * fVar126 + fVar243 * fVar243) &&
                   (int)(local_1c8 | 2) < iStack_70;
          local_2e8._8_4_ = -(uint)bVar29;
          bVar30 = fVar162 * fVar162 <=
                   auVar62._12_4_ * auVar62._12_4_ * (fVar138 * fVar138 + fVar251 * fVar251) &&
                   (int)(local_1c8 | 3) < iStack_6c;
          local_2e8._12_4_ = -(uint)bVar30;
          uVar44 = movmskps((int)pGVar39,local_2e8);
          pGVar39 = (Geometry *)(ulong)uVar44;
          if (uVar44 != 0) {
            local_68 = fVar257;
            fStack_64 = fVar123;
            fStack_60 = fVar126;
            fStack_5c = fVar138;
            fVar239 = fVar225 * fVar111 + fVar220 * fVar134 + fVar213 * local_358 +
                      fVar109 * fVar212;
            fVar242 = fVar226 * fVar111 + fVar222 * fVar134 + fVar214 * fStack_354 +
                      fVar114 * fVar212;
            fVar245 = fVar227 * fVar111 + fVar223 * fVar134 + fVar218 * fStack_350 +
                      fVar156 * fVar212;
            fVar253 = fVar235 * fVar111 + fVar224 * fVar134 + fVar219 * fStack_34c +
                      fVar189 * fVar212;
            local_3b8 = auVar12._0_4_;
            fStack_3b4 = auVar12._4_4_;
            fStack_3b0 = auVar12._8_4_;
            fVar85 = fVar178 * fVar111 + fVar183 * fVar134 + local_268 * local_358 +
                     local_3b8 * fVar212;
            fVar89 = fVar180 * fVar111 + fVar164 * fVar134 + fStack_264 * fStack_354 +
                     fStack_3b4 * fVar212;
            fVar91 = fVar125 * fVar111 + fStack_2d0 * fVar134 + fStack_260 * fStack_350 +
                     fStack_3b0 * fVar212;
            fVar94 = fVar137 * fVar111 + fStack_2cc * fVar134 + fStack_25c * fStack_34c +
                     fVar159 * fVar212;
            pfVar1 = (float *)(lVar9 + 0x21afd38 + lVar42 * 4);
            fVar109 = *pfVar1;
            fVar114 = pfVar1[1];
            fVar156 = pfVar1[2];
            fVar159 = pfVar1[3];
            pfVar1 = (float *)(lVar9 + 0x21b01bc + lVar42 * 4);
            fVar183 = *pfVar1;
            fVar164 = pfVar1[1];
            fVar178 = pfVar1[2];
            fVar180 = pfVar1[3];
            pfVar1 = (float *)(lVar9 + 0x21b0640 + lVar42 * 4);
            fVar125 = *pfVar1;
            fVar137 = pfVar1[1];
            fVar189 = pfVar1[2];
            fVar213 = pfVar1[3];
            pfVar1 = (float *)(lVar9 + 0x21b0ac4 + lVar42 * 4);
            fVar214 = *pfVar1;
            fVar218 = pfVar1[1];
            fVar219 = pfVar1[2];
            fVar220 = pfVar1[3];
            fVar110 = local_258 * fVar109 +
                      local_248 * fVar183 + fVar191 * fVar125 + fVar120 * fVar214;
            fVar112 = fStack_254 * fVar114 +
                      fStack_244 * fVar164 + fVar191 * fVar137 + fVar120 * fVar218;
            fVar113 = fStack_250 * fVar156 +
                      fStack_240 * fVar178 + fVar191 * fVar189 + fVar120 * fVar219;
            fVar127 = fStack_24c * fVar159 +
                      fStack_23c * fVar180 + fVar191 * fVar213 + fVar120 * fVar220;
            fVar244 = local_298 * fVar109 +
                      local_368 * fVar183 + fVar194 * fVar125 + fVar142 * fVar214;
            fVar252 = fStack_294 * fVar114 +
                      fStack_364 * fVar164 + fVar194 * fVar137 + fVar142 * fVar218;
            fVar255 = fStack_290 * fVar156 +
                      fStack_360 * fVar178 + fVar194 * fVar189 + fVar142 * fVar219;
            fVar258 = fStack_28c * fVar159 +
                      fStack_35c * fVar180 + fVar194 * fVar213 + fVar142 * fVar220;
            pfVar1 = (float *)(lVar9 + 0x21b2158 + lVar42 * 4);
            fVar222 = *pfVar1;
            fVar223 = pfVar1[1];
            fVar224 = pfVar1[2];
            fVar225 = pfVar1[3];
            pfVar1 = (float *)(lVar9 + 0x21b2a60 + lVar42 * 4);
            fVar226 = *pfVar1;
            fVar227 = pfVar1[1];
            fVar235 = pfVar1[2];
            fVar158 = pfVar1[3];
            pfVar1 = (float *)(lVar9 + 0x21b2ee4 + lVar42 * 4);
            fVar160 = *pfVar1;
            fVar161 = pfVar1[1];
            fVar162 = pfVar1[2];
            fVar163 = pfVar1[3];
            pfVar1 = (float *)(lVar9 + 0x21b25dc + lVar42 * 4);
            fVar184 = *pfVar1;
            fVar190 = pfVar1[1];
            fVar192 = pfVar1[2];
            fVar193 = pfVar1[3];
            fVar136 = local_258 * fVar222 +
                      local_248 * fVar184 + fVar191 * fVar226 + fVar120 * fVar160;
            fVar139 = fStack_254 * fVar223 +
                      fStack_244 * fVar190 + fVar191 * fVar227 + fVar120 * fVar161;
            fVar141 = fStack_250 * fVar224 +
                      fStack_240 * fVar192 + fVar191 * fVar235 + fVar120 * fVar162;
            fVar165 = fStack_24c * fVar225 +
                      fStack_23c * fVar193 + fVar191 * fVar158 + fVar120 * fVar163;
            fVar256 = local_298 * fVar222 +
                      local_368 * fVar184 + fVar194 * fVar226 + fVar142 * fVar160;
            fVar259 = fStack_294 * fVar223 +
                      fStack_364 * fVar190 + fVar194 * fVar227 + fVar142 * fVar161;
            fVar260 = fStack_290 * fVar224 +
                      fStack_360 * fVar192 + fVar194 * fVar235 + fVar142 * fVar162;
            fVar51 = fStack_28c * fVar225 +
                     fStack_35c * fVar193 + fVar194 * fVar158 + fVar142 * fVar163;
            auVar250._0_8_ = CONCAT44(fVar112,fVar110) & 0x7fffffff7fffffff;
            auVar250._8_4_ = ABS(fVar113);
            auVar250._12_4_ = ABS(fVar127);
            auVar175._0_8_ = CONCAT44(fVar252,fVar244) & 0x7fffffff7fffffff;
            auVar175._8_4_ = ABS(fVar255);
            auVar175._12_4_ = ABS(fVar258);
            auVar62 = maxps(auVar250,auVar175);
            auVar263._0_8_ =
                 CONCAT44(fVar114 * fVar212 +
                          fVar164 * fStack_354 + fVar137 * fVar134 + fVar218 * fVar111,
                          fVar109 * fVar212 +
                          fVar183 * local_358 + fVar125 * fVar134 + fVar214 * fVar111) &
                 0x7fffffff7fffffff;
            auVar263._8_4_ =
                 ABS(fVar156 * fVar212 +
                     fVar178 * fStack_350 + fVar189 * fVar134 + fVar219 * fVar111);
            auVar263._12_4_ =
                 ABS(fVar159 * fVar212 +
                     fVar180 * fStack_34c + fVar213 * fVar134 + fVar220 * fVar111);
            auVar62 = maxps(auVar62,auVar263);
            uVar44 = -(uint)((float)local_378._0_4_ <= auVar62._0_4_);
            uVar45 = -(uint)((float)local_378._4_4_ <= auVar62._4_4_);
            uVar46 = -(uint)(fStack_370 <= auVar62._8_4_);
            uVar47 = -(uint)(fStack_36c <= auVar62._12_4_);
            auVar176._0_4_ = ~uVar44 & (uint)fVar257;
            auVar176._4_4_ = ~uVar45 & (uint)fVar123;
            auVar176._8_4_ = ~uVar46 & (uint)fVar126;
            auVar176._12_4_ = ~uVar47 & (uint)fVar138;
            auVar233._0_4_ = (uint)fVar110 & uVar44;
            auVar233._4_4_ = (uint)fVar112 & uVar45;
            auVar233._8_4_ = (uint)fVar113 & uVar46;
            auVar233._12_4_ = (uint)fVar127 & uVar47;
            auVar233 = auVar233 | auVar176;
            fVar137 = (float)(~uVar44 & (uint)fVar237 | (uint)fVar244 & uVar44);
            fVar213 = (float)(~uVar45 & (uint)fVar240 | (uint)fVar252 & uVar45);
            fVar244 = (float)(~uVar46 & (uint)fVar243 | (uint)fVar255 & uVar46);
            fVar252 = (float)(~uVar47 & (uint)fVar251 | (uint)fVar258 & uVar47);
            auVar264._0_8_ = CONCAT44(fVar139,fVar136) & 0x7fffffff7fffffff;
            auVar264._8_4_ = ABS(fVar141);
            auVar264._12_4_ = ABS(fVar165);
            auVar117._0_8_ = CONCAT44(fVar259,fVar256) & 0x7fffffff7fffffff;
            auVar117._8_4_ = ABS(fVar260);
            auVar117._12_4_ = ABS(fVar51);
            auVar62 = maxps(auVar264,auVar117);
            auVar79._0_8_ =
                 CONCAT44(fVar223 * fVar212 +
                          fVar190 * fStack_354 + fVar227 * fVar134 + fVar161 * fVar111,
                          fVar222 * fVar212 +
                          fVar184 * local_358 + fVar226 * fVar134 + fVar160 * fVar111) &
                 0x7fffffff7fffffff;
            auVar79._8_4_ =
                 ABS(fVar224 * fVar212 +
                     fVar192 * fStack_350 + fVar235 * fVar134 + fVar162 * fVar111);
            auVar79._12_4_ =
                 ABS(fVar225 * fVar212 +
                     fVar193 * fStack_34c + fVar158 * fVar134 + fVar163 * fVar111);
            auVar62 = maxps(auVar62,auVar79);
            uVar44 = -(uint)((float)local_378._0_4_ <= auVar62._0_4_);
            uVar45 = -(uint)((float)local_378._4_4_ <= auVar62._4_4_);
            uVar46 = -(uint)(fStack_370 <= auVar62._8_4_);
            uVar47 = -(uint)(fStack_36c <= auVar62._12_4_);
            fVar257 = (float)((uint)fVar136 & uVar44 | ~uVar44 & (uint)fVar257);
            fVar123 = (float)((uint)fVar139 & uVar45 | ~uVar45 & (uint)fVar123);
            fVar184 = (float)((uint)fVar141 & uVar46 | ~uVar46 & (uint)fVar126);
            fVar190 = (float)((uint)fVar165 & uVar47 | ~uVar47 & (uint)fVar138);
            fVar222 = (float)(~uVar44 & (uint)fVar237 | (uint)fVar256 & uVar44);
            fVar224 = (float)(~uVar45 & (uint)fVar240 | (uint)fVar259 & uVar45);
            fVar226 = (float)(~uVar46 & (uint)fVar243 | (uint)fVar260 & uVar46);
            fVar235 = (float)(~uVar47 & (uint)fVar251 | (uint)fVar51 & uVar47);
            fVar180 = auVar233._0_4_;
            fVar109 = auVar233._4_4_;
            fVar114 = auVar233._8_4_;
            fVar156 = auVar233._12_4_;
            auVar152._0_4_ = fVar137 * fVar137 + fVar180 * fVar180;
            auVar152._4_4_ = fVar213 * fVar213 + fVar109 * fVar109;
            auVar152._8_4_ = fVar244 * fVar244 + fVar114 * fVar114;
            auVar152._12_4_ = fVar252 * fVar252 + fVar156 * fVar156;
            auVar62 = rsqrtps(auVar176,auVar152);
            fVar159 = auVar62._0_4_;
            fVar183 = auVar62._4_4_;
            fVar164 = auVar62._8_4_;
            fVar178 = auVar62._12_4_;
            auVar177._0_4_ = fVar159 * fVar159 * auVar152._0_4_ * 0.5 * fVar159;
            auVar177._4_4_ = fVar183 * fVar183 * auVar152._4_4_ * 0.5 * fVar183;
            auVar177._8_4_ = fVar164 * fVar164 * auVar152._8_4_ * 0.5 * fVar164;
            auVar177._12_4_ = fVar178 * fVar178 * auVar152._12_4_ * 0.5 * fVar178;
            fVar214 = fVar159 * 1.5 - auVar177._0_4_;
            fVar218 = fVar183 * 1.5 - auVar177._4_4_;
            fVar219 = fVar164 * 1.5 - auVar177._8_4_;
            fVar220 = fVar178 * 1.5 - auVar177._12_4_;
            auVar153._0_4_ = fVar222 * fVar222 + fVar257 * fVar257;
            auVar153._4_4_ = fVar224 * fVar224 + fVar123 * fVar123;
            auVar153._8_4_ = fVar226 * fVar226 + fVar184 * fVar184;
            auVar153._12_4_ = fVar235 * fVar235 + fVar190 * fVar190;
            auVar62 = rsqrtps(auVar177,auVar153);
            fVar159 = auVar62._0_4_;
            fVar183 = auVar62._4_4_;
            fVar164 = auVar62._8_4_;
            fVar178 = auVar62._12_4_;
            fVar125 = fVar159 * 1.5 - fVar159 * fVar159 * auVar153._0_4_ * 0.5 * fVar159;
            fVar183 = fVar183 * 1.5 - fVar183 * fVar183 * auVar153._4_4_ * 0.5 * fVar183;
            fVar189 = fVar164 * 1.5 - fVar164 * fVar164 * auVar153._8_4_ * 0.5 * fVar164;
            fVar178 = fVar178 * 1.5 - fVar178 * fVar178 * auVar153._12_4_ * 0.5 * fVar178;
            fVar243 = fVar137 * fVar214 * auVar211._0_4_;
            fVar138 = fVar213 * fVar218 * auVar211._4_4_;
            fVar158 = fVar244 * fVar219 * auVar211._8_4_;
            fVar258 = fVar252 * fVar220 * auVar211._12_4_;
            fVar164 = -fVar180 * fVar214 * auVar211._0_4_;
            fVar180 = -fVar109 * fVar218 * auVar211._4_4_;
            fVar137 = -fVar114 * fVar219 * auVar211._8_4_;
            fVar213 = -fVar156 * fVar220 * auVar211._12_4_;
            fVar223 = fVar214 * 0.0 * auVar211._0_4_;
            fVar225 = fVar218 * 0.0 * auVar211._4_4_;
            fVar227 = fVar219 * 0.0 * auVar211._8_4_;
            fVar237 = fVar220 * 0.0 * auVar211._12_4_;
            fVar126 = fVar222 * fVar125 * auVar249._0_4_;
            fVar259 = fVar224 * fVar183 * auVar249._4_4_;
            fVar260 = fVar226 * fVar189 * auVar249._8_4_;
            fVar51 = fVar235 * fVar178 * auVar249._12_4_;
            fVar160 = fVar254 + fVar126;
            fVar161 = fVar121 + fVar259;
            fVar162 = fVar124 + fVar260;
            fVar163 = fVar135 + fVar51;
            fVar109 = -fVar257 * fVar125 * auVar249._0_4_;
            fVar114 = -fVar123 * fVar183 * auVar249._4_4_;
            fVar156 = -fVar184 * fVar189 * auVar249._8_4_;
            fVar159 = -fVar190 * fVar178 * auVar249._12_4_;
            fVar184 = fVar140 + fVar109;
            fVar190 = fVar143 + fVar114;
            fVar192 = fVar144 + fVar156;
            fVar193 = fVar157 + fVar159;
            fVar214 = fVar125 * 0.0 * auVar249._0_4_;
            fVar218 = fVar183 * 0.0 * auVar249._4_4_;
            fVar219 = fVar189 * 0.0 * auVar249._8_4_;
            fVar220 = fVar178 * 0.0 * auVar249._12_4_;
            fVar183 = (float)local_348._0_4_ - fVar243;
            fVar178 = (float)local_348._4_4_ - fVar138;
            fVar125 = fStack_340 - fVar158;
            fVar189 = fStack_33c - fVar258;
            fVar244 = fVar239 + fVar214;
            fVar252 = fVar242 + fVar218;
            fVar255 = fVar245 + fVar219;
            fVar256 = fVar253 + fVar220;
            fVar222 = local_338 - fVar164;
            fVar224 = fStack_334 - fVar180;
            fVar226 = fStack_330 - fVar137;
            fVar235 = fStack_32c - fVar213;
            fVar240 = fVar85 - fVar223;
            fVar251 = fVar89 - fVar225;
            fVar257 = fVar91 - fVar227;
            fVar123 = fVar94 - fVar237;
            uVar44 = -(uint)(0.0 < (fVar222 * (fVar244 - fVar240) - fVar240 * (fVar184 - fVar222)) *
                                   0.0 + (fVar240 * (fVar160 - fVar183) -
                                         (fVar244 - fVar240) * fVar183) * 0.0 +
                                         ((fVar184 - fVar222) * fVar183 -
                                         (fVar160 - fVar183) * fVar222));
            uVar45 = -(uint)(0.0 < (fVar224 * (fVar252 - fVar251) - fVar251 * (fVar190 - fVar224)) *
                                   0.0 + (fVar251 * (fVar161 - fVar178) -
                                         (fVar252 - fVar251) * fVar178) * 0.0 +
                                         ((fVar190 - fVar224) * fVar178 -
                                         (fVar161 - fVar178) * fVar224));
            uVar46 = -(uint)(0.0 < (fVar226 * (fVar255 - fVar257) - fVar257 * (fVar192 - fVar226)) *
                                   0.0 + (fVar257 * (fVar162 - fVar125) -
                                         (fVar255 - fVar257) * fVar125) * 0.0 +
                                         ((fVar192 - fVar226) * fVar125 -
                                         (fVar162 - fVar125) * fVar226));
            uVar47 = -(uint)(0.0 < (fVar235 * (fVar256 - fVar123) - fVar123 * (fVar193 - fVar235)) *
                                   0.0 + (fVar123 * (fVar163 - fVar189) -
                                         (fVar256 - fVar123) * fVar189) * 0.0 +
                                         ((fVar193 - fVar235) * fVar189 -
                                         (fVar163 - fVar189) * fVar235));
            fVar126 = (float)((uint)(fVar254 - fVar126) & uVar44 |
                             ~uVar44 & (uint)((float)local_348._0_4_ + fVar243));
            fVar138 = (float)((uint)(fVar121 - fVar259) & uVar45 |
                             ~uVar45 & (uint)((float)local_348._4_4_ + fVar138));
            fVar158 = (float)((uint)(fVar124 - fVar260) & uVar46 |
                             ~uVar46 & (uint)(fStack_340 + fVar158));
            fVar135 = (float)((uint)(fVar135 - fVar51) & uVar47 |
                             ~uVar47 & (uint)(fStack_33c + fVar258));
            fVar258 = (float)((uint)(fVar140 - fVar109) & uVar44 |
                             ~uVar44 & (uint)(local_338 + fVar164));
            fVar259 = (float)((uint)(fVar143 - fVar114) & uVar45 |
                             ~uVar45 & (uint)(fStack_334 + fVar180));
            fVar260 = (float)((uint)(fVar144 - fVar156) & uVar46 |
                             ~uVar46 & (uint)(fStack_330 + fVar137));
            fVar51 = (float)((uint)(fVar157 - fVar159) & uVar47 |
                            ~uVar47 & (uint)(fStack_32c + fVar213));
            fVar214 = (float)((uint)(fVar239 - fVar214) & uVar44 |
                             ~uVar44 & (uint)(fVar85 + fVar223));
            fVar218 = (float)((uint)(fVar242 - fVar218) & uVar45 |
                             ~uVar45 & (uint)(fVar89 + fVar225));
            fVar219 = (float)((uint)(fVar245 - fVar219) & uVar46 |
                             ~uVar46 & (uint)(fVar91 + fVar227));
            fVar220 = (float)((uint)(fVar253 - fVar220) & uVar47 |
                             ~uVar47 & (uint)(fVar94 + fVar237));
            fVar164 = (float)((uint)fVar183 & uVar44 | ~uVar44 & (uint)fVar160);
            fVar180 = (float)((uint)fVar178 & uVar45 | ~uVar45 & (uint)fVar161);
            fVar137 = (float)((uint)fVar125 & uVar46 | ~uVar46 & (uint)fVar162);
            fVar213 = (float)((uint)fVar189 & uVar47 | ~uVar47 & (uint)fVar163);
            fVar223 = (float)((uint)fVar222 & uVar44 | ~uVar44 & (uint)fVar184);
            fVar225 = (float)((uint)fVar224 & uVar45 | ~uVar45 & (uint)fVar190);
            fVar227 = (float)((uint)fVar226 & uVar46 | ~uVar46 & (uint)fVar192);
            fVar237 = (float)((uint)fVar235 & uVar47 | ~uVar47 & (uint)fVar193);
            fVar243 = (float)((uint)fVar240 & uVar44 | ~uVar44 & (uint)fVar244);
            fVar254 = (float)((uint)fVar251 & uVar45 | ~uVar45 & (uint)fVar252);
            fVar121 = (float)((uint)fVar257 & uVar46 | ~uVar46 & (uint)fVar255);
            fVar124 = (float)((uint)fVar123 & uVar47 | ~uVar47 & (uint)fVar256);
            fVar140 = (float)((uint)fVar160 & uVar44 | ~uVar44 & (uint)fVar183) - fVar126;
            fVar143 = (float)((uint)fVar161 & uVar45 | ~uVar45 & (uint)fVar178) - fVar138;
            fVar144 = (float)((uint)fVar162 & uVar46 | ~uVar46 & (uint)fVar125) - fVar158;
            fVar157 = (float)((uint)fVar163 & uVar47 | ~uVar47 & (uint)fVar189) - fVar135;
            fVar222 = (float)((uint)fVar184 & uVar44 | ~uVar44 & (uint)fVar222) - fVar258;
            fVar224 = (float)((uint)fVar190 & uVar45 | ~uVar45 & (uint)fVar224) - fVar259;
            fVar226 = (float)((uint)fVar192 & uVar46 | ~uVar46 & (uint)fVar226) - fVar260;
            fVar235 = (float)((uint)fVar193 & uVar47 | ~uVar47 & (uint)fVar235) - fVar51;
            fVar240 = (float)((uint)fVar244 & uVar44 | ~uVar44 & (uint)fVar240) - fVar214;
            fVar251 = (float)((uint)fVar252 & uVar45 | ~uVar45 & (uint)fVar251) - fVar218;
            fVar257 = (float)((uint)fVar255 & uVar46 | ~uVar46 & (uint)fVar257) - fVar219;
            fVar123 = (float)((uint)fVar256 & uVar47 | ~uVar47 & (uint)fVar123) - fVar220;
            fVar184 = fVar126 - fVar164;
            fVar190 = fVar138 - fVar180;
            fVar192 = fVar158 - fVar137;
            fVar193 = fVar135 - fVar213;
            fVar109 = fVar258 - fVar223;
            fVar114 = fVar259 - fVar225;
            fVar156 = fVar260 - fVar227;
            fVar159 = fVar51 - fVar237;
            fVar183 = fVar214 - fVar243;
            fVar178 = fVar218 - fVar254;
            fVar125 = fVar219 - fVar121;
            fVar189 = fVar220 - fVar124;
            fVar160 = (fVar258 * fVar240 - fVar214 * fVar222) * 0.0 +
                      (fVar214 * fVar140 - fVar126 * fVar240) * 0.0 +
                      (fVar126 * fVar222 - fVar258 * fVar140);
            fVar161 = (fVar259 * fVar251 - fVar218 * fVar224) * 0.0 +
                      (fVar218 * fVar143 - fVar138 * fVar251) * 0.0 +
                      (fVar138 * fVar224 - fVar259 * fVar143);
            auVar132._4_4_ = fVar161;
            auVar132._0_4_ = fVar160;
            fVar162 = (fVar260 * fVar257 - fVar219 * fVar226) * 0.0 +
                      (fVar219 * fVar144 - fVar158 * fVar257) * 0.0 +
                      (fVar158 * fVar226 - fVar260 * fVar144);
            fVar163 = (fVar51 * fVar123 - fVar220 * fVar235) * 0.0 +
                      (fVar220 * fVar157 - fVar135 * fVar123) * 0.0 +
                      (fVar135 * fVar235 - fVar51 * fVar157);
            auVar268._0_4_ =
                 (fVar223 * fVar183 - fVar243 * fVar109) * 0.0 +
                 (fVar243 * fVar184 - fVar164 * fVar183) * 0.0 +
                 (fVar164 * fVar109 - fVar223 * fVar184);
            auVar268._4_4_ =
                 (fVar225 * fVar178 - fVar254 * fVar114) * 0.0 +
                 (fVar254 * fVar190 - fVar180 * fVar178) * 0.0 +
                 (fVar180 * fVar114 - fVar225 * fVar190);
            auVar268._8_4_ =
                 (fVar227 * fVar125 - fVar121 * fVar156) * 0.0 +
                 (fVar121 * fVar192 - fVar137 * fVar125) * 0.0 +
                 (fVar137 * fVar156 - fVar227 * fVar192);
            auVar268._12_4_ =
                 (fVar237 * fVar189 - fVar124 * fVar159) * 0.0 +
                 (fVar124 * fVar193 - fVar213 * fVar189) * 0.0 +
                 (fVar213 * fVar159 - fVar237 * fVar193);
            auVar132._8_4_ = fVar162;
            auVar132._12_4_ = fVar163;
            auVar62 = maxps(auVar132,auVar268);
            bVar28 = auVar62._0_4_ <= 0.0 && bVar28;
            auVar133._0_4_ = -(uint)bVar28;
            bVar27 = auVar62._4_4_ <= 0.0 && bVar27;
            auVar133._4_4_ = -(uint)bVar27;
            bVar29 = auVar62._8_4_ <= 0.0 && bVar29;
            auVar133._8_4_ = -(uint)bVar29;
            bVar30 = auVar62._12_4_ <= 0.0 && bVar30;
            auVar133._12_4_ = -(uint)bVar30;
            iVar31 = movmskps((int)puVar36,auVar133);
            if (iVar31 == 0) {
LAB_00abfeff:
              auVar119._8_8_ = uStack_380;
              auVar119._0_8_ = local_388;
            }
            else {
              fVar137 = fVar109 * fVar240 - fVar183 * fVar222;
              fVar213 = fVar114 * fVar251 - fVar178 * fVar224;
              fVar223 = fVar156 * fVar257 - fVar125 * fVar226;
              fVar225 = fVar159 * fVar123 - fVar189 * fVar235;
              fVar164 = fVar183 * fVar140 - fVar240 * fVar184;
              fVar178 = fVar178 * fVar143 - fVar251 * fVar190;
              fVar180 = fVar125 * fVar144 - fVar257 * fVar192;
              fVar125 = fVar189 * fVar157 - fVar123 * fVar193;
              fVar109 = fVar184 * fVar222 - fVar109 * fVar140;
              fVar189 = fVar190 * fVar224 - fVar114 * fVar143;
              fVar222 = fVar192 * fVar226 - fVar156 * fVar144;
              fVar224 = fVar193 * fVar235 - fVar159 * fVar157;
              auVar118._0_4_ = fVar164 * 0.0 + fVar109;
              auVar118._4_4_ = fVar178 * 0.0 + fVar189;
              auVar118._8_4_ = fVar180 * 0.0 + fVar222;
              auVar118._12_4_ = fVar125 * 0.0 + fVar224;
              auVar188._0_4_ = fVar137 * 0.0 + auVar118._0_4_;
              auVar188._4_4_ = fVar213 * 0.0 + auVar118._4_4_;
              auVar188._8_4_ = fVar223 * 0.0 + auVar118._8_4_;
              auVar188._12_4_ = fVar225 * 0.0 + auVar118._12_4_;
              auVar62 = rcpps(auVar118,auVar188);
              fVar114 = auVar62._0_4_;
              fVar156 = auVar62._4_4_;
              fVar159 = auVar62._8_4_;
              fVar183 = auVar62._12_4_;
              fVar114 = (1.0 - auVar188._0_4_ * fVar114) * fVar114 + fVar114;
              fVar156 = (1.0 - auVar188._4_4_ * fVar156) * fVar156 + fVar156;
              fVar159 = (1.0 - auVar188._8_4_ * fVar159) * fVar159 + fVar159;
              fVar183 = (1.0 - auVar188._12_4_ * fVar183) * fVar183 + fVar183;
              fVar164 = (fVar214 * fVar109 + fVar258 * fVar164 + fVar126 * fVar137) * fVar114;
              fVar178 = (fVar218 * fVar189 + fVar259 * fVar178 + fVar138 * fVar213) * fVar156;
              auVar234._4_4_ = fVar178;
              auVar234._0_4_ = fVar164;
              fVar180 = (fVar219 * fVar222 + fVar260 * fVar180 + fVar158 * fVar223) * fVar159;
              fVar125 = (fVar220 * fVar224 + fVar51 * fVar125 + fVar135 * fVar225) * fVar183;
              fVar109 = *(float *)(ray + k * 4 + 0x80);
              bVar28 = ((float)local_2a8._0_4_ <= fVar164 && fVar164 <= fVar109) && bVar28;
              auVar154._0_4_ = -(uint)bVar28;
              bVar27 = ((float)local_2a8._4_4_ <= fVar178 && fVar178 <= fVar109) && bVar27;
              auVar154._4_4_ = -(uint)bVar27;
              bVar29 = (fStack_2a0 <= fVar180 && fVar180 <= fVar109) && bVar29;
              auVar154._8_4_ = -(uint)bVar29;
              bVar30 = (fStack_29c <= fVar125 && fVar125 <= fVar109) && bVar30;
              auVar154._12_4_ = -(uint)bVar30;
              iVar31 = movmskps(iVar31,auVar154);
              if (iVar31 == 0) goto LAB_00abfeff;
              auVar155._0_8_ =
                   CONCAT44(-(uint)(auVar188._4_4_ != 0.0 && bVar27),
                            -(uint)(auVar188._0_4_ != 0.0 && bVar28));
              auVar155._8_4_ = -(uint)(auVar188._8_4_ != 0.0 && bVar29);
              auVar155._12_4_ = -(uint)(auVar188._12_4_ != 0.0 && bVar30);
              iVar31 = movmskps(iVar31,auVar155);
              auVar119._8_8_ = uStack_380;
              auVar119._0_8_ = local_388;
              if (iVar31 != 0) {
                fVar160 = fVar160 * fVar114;
                fVar161 = fVar161 * fVar156;
                fVar162 = fVar162 * fVar159;
                fVar163 = fVar163 * fVar183;
                local_4c8 = (float)((uint)(1.0 - fVar160) & uVar44 | ~uVar44 & (uint)fVar160);
                fStack_4c4 = (float)((uint)(1.0 - fVar161) & uVar45 | ~uVar45 & (uint)fVar161);
                fStack_4c0 = (float)((uint)(1.0 - fVar162) & uVar46 | ~uVar46 & (uint)fVar162);
                fStack_4bc = (float)((uint)(1.0 - fVar163) & uVar47 | ~uVar47 & (uint)fVar163);
                local_288 = (float)(~uVar44 & (uint)(auVar268._0_4_ * fVar114) |
                                   (uint)(1.0 - auVar268._0_4_ * fVar114) & uVar44);
                fStack_284 = (float)(~uVar45 & (uint)(auVar268._4_4_ * fVar156) |
                                    (uint)(1.0 - auVar268._4_4_ * fVar156) & uVar45);
                fStack_280 = (float)(~uVar46 & (uint)(auVar268._8_4_ * fVar159) |
                                    (uint)(1.0 - auVar268._8_4_ * fVar159) & uVar46);
                fStack_27c = (float)(~uVar47 & (uint)(auVar268._12_4_ * fVar183) |
                                    (uint)(1.0 - auVar268._12_4_ * fVar183) & uVar47);
                auVar119._8_4_ = auVar155._8_4_;
                auVar119._0_8_ = auVar155._0_8_;
                auVar119._12_4_ = auVar155._12_4_;
                auVar234._8_4_ = fVar180;
                auVar234._12_4_ = fVar125;
                auVar232 = auVar234;
              }
            }
            uVar44 = movmskps(iVar31,auVar119);
            puVar36 = (undefined1 *)(ulong)uVar44;
            if (uVar44 != 0) {
              fVar114 = (auVar249._0_4_ - auVar211._0_4_) * local_4c8 + auVar211._0_4_;
              fVar156 = (auVar249._4_4_ - auVar211._4_4_) * fStack_4c4 + auVar211._4_4_;
              fVar159 = (auVar249._8_4_ - auVar211._8_4_) * fStack_4c0 + auVar211._8_4_;
              fVar183 = (auVar249._12_4_ - auVar211._12_4_) * fStack_4bc + auVar211._12_4_;
              fVar109 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
              local_178._0_4_ =
                   -(uint)(fVar109 * (fVar114 + fVar114) < auVar232._0_4_) & auVar119._0_4_;
              local_178._4_4_ =
                   -(uint)(fVar109 * (fVar156 + fVar156) < auVar232._4_4_) & auVar119._4_4_;
              local_178._8_4_ =
                   -(uint)(fVar109 * (fVar159 + fVar159) < auVar232._8_4_) & auVar119._8_4_;
              local_178._12_4_ =
                   -(uint)(fVar109 * (fVar183 + fVar183) < auVar232._12_4_) & auVar119._12_4_;
              uVar44 = movmskps(uVar44,local_178);
              puVar36 = (undefined1 *)(ulong)uVar44;
              if (uVar44 != 0) {
                local_288 = local_288 + local_288 + -1.0;
                fStack_284 = fStack_284 + fStack_284 + -1.0;
                fStack_280 = fStack_280 + fStack_280 + -1.0;
                fStack_27c = fStack_27c + fStack_27c + -1.0;
                local_1f8._4_4_ = fStack_4c4;
                local_1f8._0_4_ = local_4c8;
                fStack_1f0 = fStack_4c0;
                fStack_1ec = fStack_4bc;
                local_1b8 = CONCAT44(fStack_2b4,local_2b8);
                uStack_1b0 = CONCAT44(fStack_2ac,fStack_2b0);
                local_1a8 = CONCAT44(fStack_2c4,local_2c8);
                uStack_1a0 = CONCAT44(fStack_2bc,fStack_2c0);
                pGVar39 = (context->scene->geometries).items[local_390].ptr;
                if ((pGVar39->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  bVar37 = 0;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar37 = 1, pGVar39->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  fVar109 = (float)(int)local_1c8;
                  local_168[0] = (fVar109 + local_4c8 + 0.0) * local_a8;
                  local_168[1] = (fVar109 + fStack_4c4 + 1.0) * fStack_a4;
                  local_168[2] = (fVar109 + fStack_4c0 + 2.0) * fStack_a0;
                  local_168[3] = (fVar109 + fStack_4bc + 3.0) * fStack_9c;
                  local_158 = CONCAT44(fStack_284,local_288);
                  uStack_150 = CONCAT44(fStack_27c,fStack_280);
                  local_148 = auVar232;
                  puVar36 = (undefined1 *)(ulong)(byte)uVar44;
                  local_4d8 = 0;
                  if (puVar36 != (undefined1 *)0x0) {
                    for (; ((byte)uVar44 >> local_4d8 & 1) == 0; local_4d8 = local_4d8 + 1) {
                    }
                  }
                  auVar62 = *local_320;
                  uVar5 = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_328 = context;
                  local_1e8 = local_288;
                  fStack_1e4 = fStack_284;
                  fStack_1e0 = fStack_280;
                  fStack_1dc = fStack_27c;
                  local_1d8 = auVar232;
                  local_1c4 = iVar6;
                  local_198 = fVar122;
                  fStack_194 = fVar49;
                  fStack_190 = fVar50;
                  fStack_18c = fVar83;
                  local_188 = fVar84;
                  fStack_184 = fVar87;
                  fStack_180 = fVar88;
                  fStack_17c = fVar93;
                  do {
                    local_108 = local_168[local_4d8];
                    local_f8 = *(undefined4 *)((long)&local_158 + local_4d8 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_148 + local_4d8 * 4)
                    ;
                    fVar159 = 1.0 - local_108;
                    fVar109 = local_108 * fVar159 * 4.0;
                    fVar183 = (fVar159 * fVar159 + fVar109) * 0.5;
                    fVar156 = local_108 * local_108 * 0.5;
                    fVar114 = (-local_108 * local_108 - fVar109) * 0.5;
                    local_318.context = context->user;
                    fVar109 = -fVar159 * fVar159 * 0.5;
                    local_138 = fVar109 * local_2b8 +
                                fVar114 * local_2c8 + fVar183 * fVar122 + fVar156 * fVar84;
                    local_128 = fVar109 * fStack_2b4 +
                                fVar114 * fStack_2c4 + fVar183 * fVar49 + fVar156 * fVar87;
                    local_118 = fVar109 * fStack_2b0 +
                                fVar114 * fStack_2c0 + fVar183 * fVar50 + fVar156 * fVar88;
                    fStack_134 = local_138;
                    fStack_130 = local_138;
                    fStack_12c = local_138;
                    fStack_124 = local_128;
                    fStack_120 = local_128;
                    fStack_11c = local_128;
                    fStack_114 = local_118;
                    fStack_110 = local_118;
                    fStack_10c = local_118;
                    fStack_104 = local_108;
                    fStack_100 = local_108;
                    fStack_fc = local_108;
                    uStack_f4 = local_f8;
                    uStack_f0 = local_f8;
                    uStack_ec = local_f8;
                    local_e8 = CONCAT44(uStack_94,local_98);
                    uStack_e0 = CONCAT44(uStack_8c,uStack_90);
                    local_d8 = CONCAT44(uStack_84,local_88);
                    uStack_d0 = CONCAT44(uStack_7c,uStack_80);
                    local_c8 = (local_318.context)->instID[0];
                    uStack_c4 = local_c8;
                    uStack_c0 = local_c8;
                    uStack_bc = local_c8;
                    local_b8 = (local_318.context)->instPrimID[0];
                    uStack_b4 = local_b8;
                    uStack_b0 = local_b8;
                    uStack_ac = local_b8;
                    local_318.valid = (int *)local_3a8;
                    local_318.geometryUserPtr = pGVar39->userPtr;
                    local_318.hit = (RTCHitN *)&local_138;
                    local_318.N = 4;
                    p_Var34 = pGVar39->occlusionFilterN;
                    local_3a8 = auVar62;
                    local_318.ray = (RTCRayN *)ray;
                    if (p_Var34 != (RTCFilterFunctionN)0x0) {
                      p_Var34 = (RTCFilterFunctionN)(*p_Var34)(&local_318);
                      context = local_328;
                    }
                    auVar107._0_4_ = -(uint)(local_3a8._0_4_ == 0);
                    auVar107._4_4_ = -(uint)(local_3a8._4_4_ == 0);
                    auVar107._8_4_ = -(uint)(local_3a8._8_4_ == 0);
                    auVar107._12_4_ = -(uint)(local_3a8._12_4_ == 0);
                    uVar44 = movmskps((int)p_Var34,auVar107);
                    pRVar35 = (RTCRayN *)(ulong)(uVar44 ^ 0xf);
                    if ((uVar44 ^ 0xf) == 0) {
                      auVar107 = auVar107 ^ _DAT_01f7ae20;
                    }
                    else {
                      p_Var34 = context->args->filter;
                      if ((p_Var34 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar39->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var34)(&local_318);
                        context = local_328;
                      }
                      auVar80._0_4_ = -(uint)(local_3a8._0_4_ == 0);
                      auVar80._4_4_ = -(uint)(local_3a8._4_4_ == 0);
                      auVar80._8_4_ = -(uint)(local_3a8._8_4_ == 0);
                      auVar80._12_4_ = -(uint)(local_3a8._12_4_ == 0);
                      auVar107 = auVar80 ^ _DAT_01f7ae20;
                      *(undefined1 (*) [16])(local_318.ray + 0x80) =
                           ~auVar80 & _DAT_01f7aa00 |
                           *(undefined1 (*) [16])(local_318.ray + 0x80) & auVar80;
                      pRVar35 = local_318.ray;
                    }
                    auVar108._0_4_ = auVar107._0_4_ << 0x1f;
                    auVar108._4_4_ = auVar107._4_4_ << 0x1f;
                    auVar108._8_4_ = auVar107._8_4_ << 0x1f;
                    auVar108._12_4_ = auVar107._12_4_ << 0x1f;
                    iVar31 = movmskps((int)pRVar35,auVar108);
                    if (iVar31 != 0) {
                      bVar37 = 1;
                      break;
                    }
                    *(undefined4 *)(ray + k * 4 + 0x80) = uVar5;
                    puVar36 = (undefined1 *)((ulong)puVar36 ^ 1L << (local_4d8 & 0x3f));
                    local_4d8 = 0;
                    if (puVar36 != (undefined1 *)0x0) {
                      for (; ((ulong)puVar36 >> local_4d8 & 1) == 0; local_4d8 = local_4d8 + 1) {
                      }
                    }
                    bVar37 = 0;
                  } while (puVar36 != (undefined1 *)0x0);
                }
                bVar40 = (bool)(bVar40 | bVar37);
              }
            }
          }
          iVar31 = (int)puVar36;
          lVar42 = lVar42 + 4;
        } while ((int)lVar42 < iVar6);
      }
      if (bVar40) {
        return bVar40;
      }
      fVar122 = *(float *)(ray + k * 4 + 0x80);
      auVar106._4_4_ = -(uint)(fStack_44 <= fVar122);
      auVar106._0_4_ = -(uint)(local_48 <= fVar122);
      auVar106._8_4_ = -(uint)(fStack_40 <= fVar122);
      auVar106._12_4_ = -(uint)(fStack_3c <= fVar122);
      uVar44 = movmskps(iVar31,auVar106);
      uVar44 = (uint)uVar43 & uVar44;
    } while (uVar44 != 0);
  }
  return bVar40;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }